

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

int test_strs(void)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  uint3 uVar22;
  undefined1 auVar23 [15];
  unkuint9 Var24;
  undefined1 auVar25 [11];
  undefined1 auVar26 [15];
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  uint uVar36;
  int iVar37;
  byte *pbVar38;
  int64_t extraout_RAX;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  char *unaff_RBP;
  char *pcVar43;
  ulong uVar44;
  int64_t iVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  char *pcVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long lVar67;
  int iVar77;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar78;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  byte bVar99;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  bool bVar100;
  undefined1 auVar101 [12];
  char cVar117;
  char cVar118;
  char cVar119;
  char cVar120;
  char cVar121;
  char cVar122;
  char cVar123;
  ushort uVar124;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  ushort uVar125;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  short sVar132;
  short sVar139;
  short sVar141;
  short sVar143;
  short sVar145;
  short sVar147;
  short sVar149;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  short sVar151;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  short sVar153;
  short sVar160;
  short sVar162;
  short sVar164;
  short sVar166;
  short sVar168;
  short sVar170;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  short sVar172;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  ushort uVar275;
  ushort uVar303;
  undefined1 auVar276 [12];
  ushort uVar299;
  ushort uVar300;
  ushort uVar301;
  ushort uVar302;
  ushort uVar304;
  undefined1 auVar280 [16];
  undefined1 auVar277 [12];
  ushort uVar305;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  byte bVar340;
  ushort uVar341;
  ushort uVar342;
  byte bVar375;
  ushort uVar376;
  ushort uVar377;
  byte bVar378;
  ushort uVar379;
  ushort uVar380;
  byte bVar381;
  ushort uVar382;
  ushort uVar383;
  byte bVar384;
  ushort uVar385;
  ushort uVar386;
  ushort uVar387;
  ushort uVar388;
  undefined1 auVar343 [12];
  ushort uVar389;
  ushort uVar390;
  ushort uVar391;
  ushort uVar392;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar344 [12];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  char head [5];
  char *d4;
  undefined8 local_80;
  uint local_78;
  uint local_74;
  char *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  long lStack_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined6 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [12];
  undefined1 auVar82 [14];
  undefined1 auVar86 [16];
  undefined1 auVar108 [16];
  undefined1 auVar102 [14];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar105 [16];
  undefined1 auVar111 [16];
  short sVar140;
  short sVar142;
  short sVar144;
  short sVar146;
  short sVar148;
  short sVar150;
  short sVar152;
  short sVar161;
  short sVar163;
  short sVar165;
  short sVar167;
  short sVar169;
  short sVar171;
  short sVar173;
  undefined1 auVar278 [14];
  undefined1 auVar279 [14];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar350 [16];
  undefined1 auVar364 [16];
  undefined1 auVar345 [14];
  undefined1 auVar351 [16];
  undefined1 auVar346 [14];
  undefined1 auVar365 [16];
  undefined1 auVar352 [16];
  undefined1 auVar366 [16];
  undefined1 auVar347 [16];
  undefined1 auVar353 [16];
  undefined1 auVar361 [16];
  undefined1 auVar367 [16];
  
  _plan(0x6b,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_strs");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0x01",0xc,1,_stdout);
  fputc(10,_stdout);
  str[0] = 'a';
  buf[1] = -0x5f;
  buf[2] = 'a';
  pcVar43 = "0x01 == len2";
  _ok(1,"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x220,
      "len(mp_decode_str(x, %u))",1);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011c9b3:
      uVar36 = (uint)(byte)buf[2];
      pcVar43 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0011c9d4:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar43 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011c9c3;
LAB_0011c9eb:
      if ((byte)(buf[1] + 0x40U) < 0xe0) {
        test_strs();
        goto LAB_00121add;
      }
      uVar36 = uVar36 & 0x1f;
      pcVar43 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011c9d4;
      if (uVar36 != 0xd9) goto LAB_0011c9eb;
      goto LAB_0011c9b3;
    }
LAB_0011c9c3:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar43 = buf + 6;
  }
  unaff_RBP = pcVar43 + uVar36;
  _ok((uint)(uVar36 == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x220,
      "len(mp_decode_strbin(x, %u))",1);
  lVar39 = 1;
  pcVar43 = buf + 1;
  do {
    local_80 = (byte *)pcVar43 + 1;
    lVar40 = (long)""[(byte)*pcVar43];
    if (lVar40 < 0) {
      if (*pcVar43 == 0xd9) {
        local_80 = (byte *)pcVar43 + (ulong)((byte *)pcVar43)[1] + 2;
      }
      else {
        if ((byte)""[(byte)*pcVar43] < 0xe1) goto LAB_00121b14;
        lVar39 = lVar39 - lVar40;
      }
    }
    else {
      local_80 = local_80 + lVar40;
    }
    bVar100 = 1 < lVar39;
    lVar39 = lVar39 + -1;
    pcVar43 = (char *)local_80;
  } while (bVar100);
  while( true ) {
    local_70 = buf + 1;
    iVar37 = mp_check(&local_70,(char *)(local_80 + 1));
    uVar53 = 0;
    _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x01)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x220,"mp_check_str(mp_encode_str(x, 0x01))");
    pcVar51 = buf + 3;
    _ok((uint)(unaff_RBP == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x220,"len(mp_decode_str(x, 0x01)");
    _ok((uint)(local_80 == (byte *)(buf + 3)),"d1 == d3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x220,"len(mp_next_str(x, 0x01)");
    _ok((uint)(local_70 == buf + 3),"d1 == d4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x220,"len(mp_check_str(x, 0x01)");
    unaff_RBP = (char *)0x1;
    _ok(1,"mp_sizeof_str(0x01) == (uint32_t) (d1 - data)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x220,"mp_sizeof_str(0x01)");
    _ok((uint)(str[0] == buf[2]),"memcmp(s1, s2, 0x01) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x220,"mp_encode_str(x, 0x01) == x");
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("str len=0x1e",0xc,1,_stdout);
    fputc(10,_stdout);
    iVar37 = (int)DAT_0013f1f0;
    iVar77 = DAT_0013f1f0._4_4_;
    auVar280 = _DAT_0013f1b0;
    do {
      bVar100 = SUB164(auVar280 ^ _DAT_0013f1c0,4) == iVar77 &&
                SUB164(auVar280 ^ _DAT_0013f1c0,0) < iVar37;
      cVar117 = (char)uVar53;
      if (bVar100) {
        cVar118 = cVar117 + -0x1a;
        if (uVar53 < 0x1a) {
          cVar118 = cVar117;
        }
        str[uVar53] = cVar118 + 'a';
      }
      if (bVar100) {
        cVar118 = -0x19;
        if (uVar53 < 0x1a) {
          cVar118 = '\x01';
        }
        str[uVar53 + 1] = cVar118 + cVar117 + 'a';
      }
      uVar53 = uVar53 + 2;
      lVar39 = auVar280._8_8_;
      auVar280._0_8_ = auVar280._0_8_ + 2;
      auVar280._8_8_ = lVar39 + 2;
    } while (uVar53 != 0x1e);
    buf[1] = -0x42;
    buf[2] = (char)str._0_8_;
    buf[3] = SUB81(str._0_8_,1);
    buf[4] = SUB81(str._0_8_,2);
    buf[5] = SUB81(str._0_8_,3);
    buf[6] = SUB81(str._0_8_,4);
    buf[7] = SUB81(str._0_8_,5);
    buf[8] = SUB81(str._0_8_,6);
    buf[9] = SUB81(str._0_8_,7);
    buf[10] = str[8];
    buf[0xb] = str[9];
    buf[0xc] = str[10];
    buf[0xd] = str[0xb];
    buf[0xe] = str[0xc];
    buf[0xf] = str[0xd];
    buf[0x10] = str[0xe];
    buf[0x11] = str[0xf];
    buf[0x12] = str[0x10];
    buf[0x13] = str[0x11];
    buf[0x14] = str[0x12];
    buf[0x15] = str[0x13];
    buf[0x16] = str[0x14];
    buf[0x17] = str[0x15];
    buf[0x18] = str[0x16];
    buf[0x19] = str[0x17];
    buf[0x1a] = str[0x18];
    buf[0x1b] = str[0x19];
    buf[0x1c] = str[0x1a];
    buf[0x1d] = str[0x1b];
    buf[0x1e] = str[0x1c];
    buf[0x1f] = str[0x1d];
    pcVar43 = "0x1e == len2";
    _ok(1,"0x1e == len2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x221,"len(mp_decode_str(x, %u))",0x1e);
    uVar36 = (uint)(byte)buf[1];
    if (0xd8 < uVar36) break;
    if (uVar36 == 0xc4) {
LAB_0011cd1c:
      uVar36 = (uint)(byte)buf[2];
      goto LAB_0011cd63;
    }
    if (uVar36 == 0xc5) {
LAB_0011cd36:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar51 = buf + 4;
      goto LAB_0011cd63;
    }
    if (uVar36 == 0xc6) goto LAB_0011cd25;
LAB_0011cd4d:
    if (0xdf < (byte)(buf[1] + 0x40U)) {
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
      goto LAB_0011cd63;
    }
LAB_00121add:
    test_strs();
LAB_00121ae2:
    test_strs();
LAB_00121ae7:
    test_strs();
LAB_00121aec:
    test_strs();
LAB_00121af1:
    test_strs();
LAB_00121af6:
    test_strs();
LAB_00121afb:
    test_strs();
LAB_00121b00:
    test_strs();
LAB_00121b05:
    test_strs();
LAB_00121b0a:
    test_strs();
LAB_00121b0f:
    test_strs();
    lVar39 = extraout_RAX;
LAB_00121b14:
    local_80 = (byte *)pcVar43;
    mp_next_slowpath((char **)&local_80,lVar39);
  }
  if (uVar36 != 0xdb) {
    if (uVar36 == 0xda) goto LAB_0011cd36;
    if (uVar36 != 0xd9) goto LAB_0011cd4d;
    goto LAB_0011cd1c;
  }
LAB_0011cd25:
  uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
  uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
           CONCAT13(buf[5],uVar22) << 0x18;
  pcVar51 = buf + 6;
LAB_0011cd63:
  _ok((uint)(uVar36 == 0x1e),"0x1e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x221,
      "len(mp_decode_strbin(x, %u))",0x1e);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x1e));
  uVar53 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x1e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x221,
      "mp_check_str(mp_encode_str(x, 0x1e))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x20),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x221,
      "len(mp_decode_str(x, 0x1e)");
  _ok((uint)(local_80 == (byte *)(buf + 0x20)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x221,
      "len(mp_next_str(x, 0x1e)");
  _ok((uint)(local_70 == buf + 0x20),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x221,
      "len(mp_check_str(x, 0x1e)");
  unaff_RBP = (char *)0x1;
  _ok(1,"mp_sizeof_str(0x1e) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x221,
      "mp_sizeof_str(0x1e)");
  auVar56[0] = -(str[0xe] == buf[0x10]);
  auVar56[1] = -(str[0xf] == buf[0x11]);
  auVar56[2] = -(str[0x10] == buf[0x12]);
  auVar56[3] = -(str[0x11] == buf[0x13]);
  auVar56[4] = -(str[0x12] == buf[0x14]);
  auVar56[5] = -(str[0x13] == buf[0x15]);
  auVar56[6] = -(str[0x14] == buf[0x16]);
  auVar56[7] = -(str[0x15] == buf[0x17]);
  auVar56[8] = -(str[0x16] == buf[0x18]);
  auVar56[9] = -(str[0x17] == buf[0x19]);
  auVar56[10] = -(str[0x18] == buf[0x1a]);
  auVar56[0xb] = -(str[0x19] == buf[0x1b]);
  auVar56[0xc] = -(str[0x1a] == buf[0x1c]);
  auVar56[0xd] = -(str[0x1b] == buf[0x1d]);
  auVar56[0xe] = -(str[0x1c] == buf[0x1e]);
  auVar56[0xf] = -(str[0x1d] == buf[0x1f]);
  auVar68[0] = -(buf[2] == str[0]);
  auVar68[1] = -(buf[3] == str[1]);
  auVar68[2] = -(buf[4] == str[2]);
  auVar68[3] = -(buf[5] == str[3]);
  auVar68[4] = -(buf[6] == str[4]);
  auVar68[5] = -(buf[7] == str[5]);
  auVar68[6] = -(buf[8] == str[6]);
  auVar68[7] = -(buf[9] == str[7]);
  auVar68[8] = -(buf[10] == str[8]);
  auVar68[9] = -(buf[0xb] == str[9]);
  auVar68[10] = -(buf[0xc] == str[10]);
  auVar68[0xb] = -(buf[0xd] == str[0xb]);
  auVar68[0xc] = -(buf[0xe] == str[0xc]);
  auVar68[0xd] = -(buf[0xf] == str[0xd]);
  auVar68[0xe] = -(buf[0x10] == str[0xe]);
  auVar68[0xf] = -(buf[0x11] == str[0xf]);
  auVar68 = auVar68 & auVar56;
  _ok((uint)((ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar68[0xf] >> 7) << 0xf) == 0xffff),
      "memcmp(s1, s2, 0x1e) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x221,
      "mp_encode_str(x, 0x1e) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0x1f",0xc,1,_stdout);
  fputc(10,_stdout);
  auVar280 = _DAT_0013f1c0;
  iVar37 = (int)DAT_0013f200;
  iVar77 = DAT_0013f200._4_4_;
  auVar176 = _DAT_0013f1b0;
  do {
    bVar100 = SUB164(auVar176 ^ auVar280,4) == iVar77 && SUB164(auVar176 ^ auVar280,0) < iVar37;
    cVar117 = (char)uVar53;
    if (bVar100) {
      cVar118 = cVar117 + -0x1a;
      if (uVar53 < 0x1a) {
        cVar118 = cVar117;
      }
      str[uVar53] = cVar118 + 'a';
    }
    if (bVar100) {
      cVar118 = -0x19;
      if (uVar53 < 0x1a) {
        cVar118 = '\x01';
      }
      str[uVar53 + 1] = cVar118 + cVar117 + 'a';
    }
    uVar53 = uVar53 + 2;
    lVar39 = auVar176._8_8_;
    auVar176._0_8_ = auVar176._0_8_ + 2;
    auVar176._8_8_ = lVar39 + 2;
  } while (uVar53 != 0x20);
  buf[1] = -0x41;
  buf[2] = (char)str._0_8_;
  buf[3] = SUB81(str._0_8_,1);
  buf[4] = SUB81(str._0_8_,2);
  buf[5] = SUB81(str._0_8_,3);
  buf[6] = SUB81(str._0_8_,4);
  buf[7] = SUB81(str._0_8_,5);
  buf[8] = SUB81(str._0_8_,6);
  buf[9] = SUB81(str._0_8_,7);
  buf[10] = str[8];
  buf[0xb] = str[9];
  buf[0xc] = str[10];
  buf[0xd] = str[0xb];
  buf[0xe] = str[0xc];
  buf[0xf] = str[0xd];
  buf[0x10] = str[0xe];
  buf[0x11] = str[0xf];
  buf[0x12] = str[0x10];
  buf[0x13] = str[0x11];
  buf[0x14] = str[0x12];
  buf[0x15] = str[0x13];
  buf[0x16] = str[0x14];
  buf[0x17] = str[0x15];
  buf[0x18] = str[0x16];
  buf[0x19] = str[0x17];
  buf[0x1a] = str[0x18];
  buf[0x1b] = str[0x19];
  buf[0x1c] = str[0x1a];
  buf[0x1d] = str[0x1b];
  buf[0x1e] = str[0x1c];
  buf[0x1f] = str[0x1d];
  buf[0x20] = str[0x1e];
  pcVar43 = "0x1f == len2";
  _ok(1,"0x1f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "len(mp_decode_str(x, %u))",0x1f);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011d0a6:
      uVar36 = (uint)(byte)buf[2];
      pcVar43 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0011d0c7:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar43 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011d0b6;
LAB_0011d0de:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121ae2;
      uVar36 = uVar36 & 0x1f;
      pcVar43 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011d0c7;
      if (uVar36 != 0xd9) goto LAB_0011d0de;
      goto LAB_0011d0a6;
    }
LAB_0011d0b6:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar43 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x1f),"0x1f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "len(mp_decode_strbin(x, %u))",0x1f);
  local_80 = (byte *)(buf + 1);
  iVar45 = 1;
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    local_80 = pbVar38;
    iVar45 = iVar45 + -1;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x1f));
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x1f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "mp_check_str(mp_encode_str(x, 0x1f))");
  _ok((uint)(pcVar43 + uVar36 == buf + 0x21),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "len(mp_decode_str(x, 0x1f)");
  _ok((uint)(local_80 == (byte *)(buf + 0x21)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "len(mp_next_str(x, 0x1f)");
  _ok((uint)(local_70 == buf + 0x21),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "len(mp_check_str(x, 0x1f)");
  _ok(1,"mp_sizeof_str(0x1f) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "mp_sizeof_str(0x1f)");
  auVar83[0] = -(buf[0x11] == str[0xf]);
  auVar83[1] = -(buf[0x12] == str[0x10]);
  auVar83[2] = -(buf[0x13] == str[0x11]);
  auVar83[3] = -(buf[0x14] == str[0x12]);
  auVar83[4] = -(buf[0x15] == str[0x13]);
  auVar83[5] = -(buf[0x16] == str[0x14]);
  auVar83[6] = -(buf[0x17] == str[0x15]);
  auVar83[7] = -(buf[0x18] == str[0x16]);
  auVar83[8] = -(buf[0x19] == str[0x17]);
  auVar83[9] = -(buf[0x1a] == str[0x18]);
  auVar83[10] = -(buf[0x1b] == str[0x19]);
  auVar83[0xb] = -(buf[0x1c] == str[0x1a]);
  auVar83[0xc] = -(buf[0x1d] == str[0x1b]);
  auVar83[0xd] = -(buf[0x1e] == str[0x1c]);
  auVar83[0xe] = -(buf[0x1f] == str[0x1d]);
  auVar83[0xf] = -(buf[0x20] == str[0x1e]);
  auVar57[0] = -(buf[2] == str[0]);
  auVar57[1] = -(buf[3] == str[1]);
  auVar57[2] = -(buf[4] == str[2]);
  auVar57[3] = -(buf[5] == str[3]);
  auVar57[4] = -(buf[6] == str[4]);
  auVar57[5] = -(buf[7] == str[5]);
  auVar57[6] = -(buf[8] == str[6]);
  auVar57[7] = -(buf[9] == str[7]);
  auVar57[8] = -(buf[10] == str[8]);
  auVar57[9] = -(buf[0xb] == str[9]);
  auVar57[10] = -(buf[0xc] == str[10]);
  auVar57[0xb] = -(buf[0xd] == str[0xb]);
  auVar57[0xc] = -(buf[0xe] == str[0xc]);
  auVar57[0xd] = -(buf[0xf] == str[0xd]);
  auVar57[0xe] = -(buf[0x10] == str[0xe]);
  auVar57[0xf] = -(buf[0x11] == str[0xf]);
  auVar57 = auVar57 & auVar83;
  _ok((uint)((ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar57[0xf] >> 7) << 0xf) == 0xffff),
      "memcmp(s1, s2, 0x1f) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x222,
      "mp_encode_str(x, 0x1f) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0x20",0xc,1,_stdout);
  fputc(10,_stdout);
  builtin_strncpy(str,"abcdefghijklmnopqrstuvwxyzabcdef",0x20);
  buf[1] = -0x27;
  buf[2] = ' ';
  buf[3] = 'a';
  buf[4] = 'b';
  buf[5] = 'c';
  buf[6] = 'd';
  buf[7] = 'e';
  buf[8] = 'f';
  buf[9] = 'g';
  buf[10] = 'h';
  buf[0xb] = 'i';
  buf[0xc] = 'j';
  buf[0xd] = 'k';
  buf[0xe] = 'l';
  buf[0xf] = 'm';
  buf[0x10] = 'n';
  buf[0x11] = 'o';
  buf[0x12] = 'p';
  buf[0x13] = 'q';
  buf[0x14] = 'r';
  buf[0x15] = 's';
  buf[0x16] = 't';
  buf[0x17] = 'u';
  buf[0x18] = 'v';
  buf[0x19] = 'w';
  buf[0x1a] = 'x';
  buf[0x1b] = 'y';
  buf[0x1c] = 'z';
  buf[0x1d] = 'a';
  buf[0x1e] = 'b';
  buf[0x1f] = 'c';
  buf[0x20] = 'd';
  buf[0x21] = 'e';
  buf[0x22] = 'f';
  pcVar43 = "0x20 == len2";
  _ok(1,"0x20 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "len(mp_decode_str(x, %u))",0x20);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011d3a9:
      uVar36 = (uint)(byte)buf[2];
      pcVar43 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0011d3ca:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar43 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011d3b9;
LAB_0011d3e1:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121ae7;
      uVar36 = uVar36 & 0x1f;
      pcVar43 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011d3ca;
      if (uVar36 != 0xd9) goto LAB_0011d3e1;
      goto LAB_0011d3a9;
    }
LAB_0011d3b9:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar43 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x20),"0x20 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "len(mp_decode_strbin(x, %u))",0x20);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x20));
  lVar40 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x20)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "mp_check_str(mp_encode_str(x, 0x20))");
  _ok((uint)(pcVar43 + uVar36 == buf + 0x23),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "len(mp_decode_str(x, 0x20)");
  _ok((uint)(local_80 == (byte *)(buf + 0x23)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "len(mp_next_str(x, 0x20)");
  _ok((uint)(local_70 == buf + 0x23),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "len(mp_check_str(x, 0x20)");
  _ok(1,"mp_sizeof_str(0x20) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "mp_sizeof_str(0x20)");
  auVar58[0] = -(buf[0x13] == str[0x10]);
  auVar58[1] = -(buf[0x14] == str[0x11]);
  auVar58[2] = -(buf[0x15] == str[0x12]);
  auVar58[3] = -(buf[0x16] == str[0x13]);
  auVar58[4] = -(buf[0x17] == str[0x14]);
  auVar58[5] = -(buf[0x18] == str[0x15]);
  auVar58[6] = -(buf[0x19] == str[0x16]);
  auVar58[7] = -(buf[0x1a] == str[0x17]);
  auVar58[8] = -(buf[0x1b] == str[0x18]);
  auVar58[9] = -(buf[0x1c] == str[0x19]);
  auVar58[10] = -(buf[0x1d] == str[0x1a]);
  auVar58[0xb] = -(buf[0x1e] == str[0x1b]);
  auVar58[0xc] = -(buf[0x1f] == str[0x1c]);
  auVar58[0xd] = -(buf[0x20] == str[0x1d]);
  auVar58[0xe] = -(buf[0x21] == str[0x1e]);
  auVar58[0xf] = -(buf[0x22] == str[0x1f]);
  auVar69[0] = -(buf[3] == str[0]);
  auVar69[1] = -(buf[4] == str[1]);
  auVar69[2] = -(buf[5] == str[2]);
  auVar69[3] = -(buf[6] == str[3]);
  auVar69[4] = -(buf[7] == str[4]);
  auVar69[5] = -(buf[8] == str[5]);
  auVar69[6] = -(buf[9] == str[6]);
  auVar69[7] = -(buf[10] == str[7]);
  auVar69[8] = -(buf[0xb] == str[8]);
  auVar69[9] = -(buf[0xc] == str[9]);
  auVar69[10] = -(buf[0xd] == str[10]);
  auVar69[0xb] = -(buf[0xe] == str[0xb]);
  auVar69[0xc] = -(buf[0xf] == str[0xc]);
  auVar69[0xd] = -(buf[0x10] == str[0xd]);
  auVar69[0xe] = -(buf[0x11] == str[0xe]);
  auVar69[0xf] = -(buf[0x12] == str[0xf]);
  auVar69 = auVar69 & auVar58;
  _ok((uint)((ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar69[0xf] >> 7) << 0xf) == 0xffff),
      "memcmp(s1, s2, 0x20) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x223,
      "mp_encode_str(x, 0x20) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0xfe",0xc,1,_stdout);
  fputc(10,_stdout);
  lVar67 = 0xc;
  auVar59 = _DAT_0013f230;
  auVar84 = _DAT_0013f250;
  auVar103 = _DAT_0013f260;
  auVar126 = _DAT_0013f270;
  auVar133 = _DAT_0013f280;
  auVar154 = _DAT_0013f290;
  auVar174 = _DAT_0013f1b0;
  auVar185 = _DAT_0013f2a0;
  lVar39 = 0xd;
  do {
    lStack_60 = lVar39;
    local_68._0_2_ = (undefined2)lVar67;
    local_68._2_2_ = (undefined2)((ulong)lVar67 >> 0x10);
    uStack_64 = (undefined4)((ulong)lVar67 >> 0x20);
    auVar280 = auVar174 ^ _DAT_0013f1c0;
    auVar324._0_4_ = -(uint)(auVar280._0_4_ < -0x7fffff02);
    auVar324._4_4_ = -(uint)(auVar280._0_4_ < -0x7fffff02);
    auVar324._8_4_ = -(uint)(auVar280._8_4_ < -0x7fffff02);
    auVar324._12_4_ = -(uint)(auVar280._8_4_ < -0x7fffff02);
    auVar306._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar306._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar306._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar306._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar306 = auVar306 & auVar324;
    auVar280 = pshuflw(auVar324,auVar306,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    bVar92 = auVar185[8];
    bVar93 = auVar185[9];
    bVar94 = auVar185[10];
    bVar95 = auVar185[0xb];
    bVar96 = auVar185[0xc];
    bVar97 = auVar185[0xd];
    bVar98 = auVar185[0xe];
    bVar99 = auVar185[0xf];
    uVar275 = (ushort)((ushort)bVar92 * 0x4f) >> 8;
    uVar299 = (ushort)((ushort)bVar93 * 0x4f) >> 8;
    uVar300 = (ushort)((ushort)bVar94 * 0x4f) >> 8;
    uVar301 = (ushort)((ushort)bVar95 * 0x4f) >> 8;
    uVar302 = (ushort)((ushort)bVar96 * 0x4f) >> 8;
    uVar303 = (ushort)((ushort)bVar97 * 0x4f) >> 8;
    uVar304 = (ushort)((ushort)bVar98 * 0x4f) >> 8;
    uVar305 = (ushort)((ushort)bVar99 * 0x4f) >> 8;
    cVar123 = auVar185[7];
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar185._0_13_;
    auVar1[0xe] = cVar123;
    cVar122 = auVar185[6];
    auVar4[0xc] = cVar122;
    auVar4._0_12_ = auVar185._0_12_;
    auVar4._13_2_ = auVar1._13_2_;
    auVar7[0xb] = 0;
    auVar7._0_11_ = auVar185._0_11_;
    auVar7._12_3_ = auVar4._12_3_;
    cVar121 = auVar185[5];
    auVar10[10] = cVar121;
    auVar10._0_10_ = auVar185._0_10_;
    auVar10._11_4_ = auVar7._11_4_;
    auVar13[9] = 0;
    auVar13._0_9_ = auVar185._0_9_;
    auVar13._10_5_ = auVar10._10_5_;
    cVar120 = auVar185[4];
    auVar16[8] = cVar120;
    auVar16._0_8_ = auVar185._0_8_;
    auVar16._9_6_ = auVar13._9_6_;
    auVar23._7_8_ = 0;
    auVar23._0_7_ = auVar16._8_7_;
    cVar119 = auVar185[3];
    Var24 = CONCAT81(SUB158(auVar23 << 0x40,7),cVar119);
    auVar30._9_6_ = 0;
    auVar30._0_9_ = Var24;
    cVar118 = auVar185[2];
    auVar25._1_10_ = SUB1510(auVar30 << 0x30,5);
    auVar25[0] = cVar118;
    auVar31._11_4_ = 0;
    auVar31._0_11_ = auVar25;
    cVar117 = auVar185[1];
    auVar19[2] = cVar117;
    auVar19._0_2_ = auVar185._0_2_;
    auVar19._3_12_ = SUB1512(auVar31 << 0x20,3);
    uVar341 = (auVar185._0_2_ & 0xff) * 0x4f;
    uVar376 = auVar19._2_2_ * 0x4f;
    uVar379 = auVar25._0_2_ * 0x4f;
    uVar382 = (short)Var24 * 0x4f;
    uVar385 = auVar16._8_2_ * 0x4f;
    uVar387 = auVar10._10_2_ * 0x4f;
    uVar389 = auVar4._12_2_ * 0x4f;
    uVar391 = (auVar1._13_2_ >> 8) * 0x4f;
    uVar342 = uVar341 >> 8;
    uVar377 = uVar376 >> 8;
    uVar380 = uVar379 >> 8;
    uVar383 = uVar382 >> 8;
    uVar386 = uVar385 >> 8;
    uVar388 = uVar387 >> 8;
    uVar390 = uVar389 >> 8;
    uVar392 = uVar391 >> 8;
    uVar341 = CONCAT11((uVar377 != 0) * (uVar377 < 0x100) * (char)(uVar376 >> 8) - (0xff < uVar377),
                       (uVar342 != 0) * (uVar342 < 0x100) * (char)(uVar341 >> 8) - (0xff < uVar342))
    ;
    uVar78 = CONCAT13((uVar383 != 0) * (uVar383 < 0x100) * (char)(uVar382 >> 8) - (0xff < uVar383),
                      CONCAT12((uVar380 != 0) * (uVar380 < 0x100) * (char)(uVar379 >> 8) -
                               (0xff < uVar380),uVar341));
    uVar79 = CONCAT15((uVar388 != 0) * (uVar388 < 0x100) * (char)(uVar387 >> 8) - (0xff < uVar388),
                      CONCAT14((uVar386 != 0) * (uVar386 < 0x100) * (char)(uVar385 >> 8) -
                               (0xff < uVar386),uVar78));
    uVar80 = CONCAT17((uVar392 != 0) * (uVar392 < 0x100) * (char)(uVar391 >> 8) - (0xff < uVar392),
                      CONCAT16((uVar390 != 0) * (uVar390 < 0x100) * (char)(uVar389 >> 8) -
                               (0xff < uVar390),uVar79));
    auVar343._0_10_ =
         CONCAT19((uVar299 != 0) * (uVar299 < 0x100) * (char)((ushort)((ushort)bVar93 * 0x4f) >> 8)
                  - (0xff < uVar299),
                  CONCAT18((uVar275 != 0) * (uVar275 < 0x100) *
                           (char)((ushort)((ushort)bVar92 * 0x4f) >> 8) - (0xff < uVar275),uVar80));
    auVar343[10] = (uVar300 != 0) * (uVar300 < 0x100) * (char)((ushort)((ushort)bVar94 * 0x4f) >> 8)
                   - (0xff < uVar300);
    auVar343[0xb] =
         (uVar301 != 0) * (uVar301 < 0x100) * (char)((ushort)((ushort)bVar95 * 0x4f) >> 8) -
         (0xff < uVar301);
    auVar345[0xc] =
         (uVar302 != 0) * (uVar302 < 0x100) * (char)((ushort)((ushort)bVar96 * 0x4f) >> 8) -
         (0xff < uVar302);
    auVar345._0_12_ = auVar343;
    auVar345[0xd] =
         (uVar303 != 0) * (uVar303 < 0x100) * (char)((ushort)((ushort)bVar97 * 0x4f) >> 8) -
         (0xff < uVar303);
    auVar347[0xe] =
         (uVar304 != 0) * (uVar304 < 0x100) * (char)((ushort)((ushort)bVar98 * 0x4f) >> 8) -
         (0xff < uVar304);
    auVar347._0_14_ = auVar345;
    auVar347[0xf] =
         (uVar305 != 0) * (uVar305 < 0x100) * (char)((ushort)((ushort)bVar99 * 0x4f) >> 8) -
         (0xff < uVar305);
    auVar348._0_2_ = uVar341 >> 3;
    auVar348._2_2_ = (ushort)((uint)uVar78 >> 0x13);
    auVar348._4_2_ = (ushort)((uint6)uVar79 >> 0x23);
    auVar348._6_2_ = (ushort)((ulong)uVar80 >> 0x33);
    auVar348._8_2_ = (ushort)((unkuint10)auVar343._0_10_ >> 0x43);
    auVar348._10_2_ = auVar343._10_2_ >> 3;
    auVar348._12_2_ = auVar345._12_2_ >> 3;
    auVar348._14_2_ = auVar347._14_2_ >> 3;
    auVar348 = auVar348 & _DAT_0013f2d0;
    sVar132 = CONCAT11(auVar348[8],auVar348[8]);
    uVar78 = CONCAT13(auVar348[9],CONCAT12(auVar348[9],sVar132));
    uVar79 = CONCAT15(auVar348[10],CONCAT14(auVar348[10],uVar78));
    uVar80 = CONCAT17(auVar348[0xb],CONCAT16(auVar348[0xb],uVar79));
    auVar276._0_10_ = CONCAT19(auVar348[0xc],CONCAT18(auVar348[0xc],uVar80));
    auVar276[10] = auVar348[0xd];
    auVar276[0xb] = auVar348[0xd];
    auVar278[0xc] = auVar348[0xe];
    auVar278._0_12_ = auVar276;
    auVar278[0xd] = auVar348[0xe];
    auVar281[0xf] = auVar348[0xf];
    auVar281[0xe] = auVar281[0xf];
    auVar281._0_14_ = auVar278;
    uVar275 = sVar132 * 0x1a;
    uVar300 = (short)((uint)uVar78 >> 0x10) * 0x1a;
    uVar302 = (short)((uint6)uVar79 >> 0x20) * 0x1a;
    uVar304 = (short)((ulong)uVar80 >> 0x30) * 0x1a;
    uVar341 = (short)((unkuint10)auVar276._0_10_ >> 0x40) * 0x1a;
    uVar376 = auVar276._10_2_ * 0x1a;
    uVar379 = auVar278._12_2_ * 0x1a;
    uVar382 = auVar281._14_2_ * 0x1a;
    uVar299 = uVar275 & 0xff;
    uVar301 = uVar300 & 0xff;
    uVar303 = uVar302 & 0xff;
    uVar305 = uVar304 & 0xff;
    uVar342 = uVar341 & 0xff;
    uVar377 = uVar376 & 0xff;
    uVar380 = uVar379 & 0xff;
    uVar383 = uVar382 & 0xff;
    auVar353._0_14_ = auVar348._0_14_;
    auVar353[0xe] = auVar348[7];
    auVar353[0xf] = auVar348[7];
    auVar352._14_2_ = auVar353._14_2_;
    auVar352._0_13_ = auVar348._0_13_;
    auVar352[0xd] = auVar348[6];
    auVar351._13_3_ = auVar352._13_3_;
    auVar351._0_12_ = auVar348._0_12_;
    auVar351[0xc] = auVar348[6];
    auVar350._12_4_ = auVar351._12_4_;
    auVar350._0_11_ = auVar348._0_11_;
    auVar350[0xb] = auVar348[5];
    auVar349._11_5_ = auVar350._11_5_;
    auVar349._0_10_ = auVar348._0_10_;
    auVar349[10] = auVar348[5];
    bVar340 = auVar348[0] * '\x1a';
    bVar375 = auVar348[1] * '\x1a';
    bVar378 = auVar348[2] * '\x1a';
    bVar381 = auVar348[3] * '\x1a';
    bVar384 = auVar348[4] * '\x1a';
    uVar390 = auVar349._10_2_ * 0x1a;
    uVar392 = auVar351._12_2_ * 0x1a;
    uVar385 = (ushort)bVar340;
    uVar386 = (ushort)bVar375;
    uVar387 = (ushort)bVar378;
    uVar388 = (ushort)bVar381;
    uVar389 = (ushort)bVar384;
    uVar391 = uVar390 & 0xff;
    uVar124 = uVar392 & 0xff;
    uVar125 = auVar352._14_2_ * 0x1a & 0xff;
    if ((auVar280 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40] = (auVar185[0] - ((uVar385 != 0) * (uVar385 < 0x100) * bVar340 - (0xff < uVar385))
                    ) + 'a';
    }
    auVar280 = packssdw(auVar306,auVar306);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._0_4_ >> 8 & 1) != 0) {
      str[lVar40 + 1] =
           (cVar117 - ((uVar386 != 0) * (uVar386 < 0x100) * bVar375 - (0xff < uVar386))) + 'a';
    }
    auVar280 = auVar154 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar325._4_4_ = iVar37;
    auVar325._0_4_ = iVar37;
    auVar325._8_4_ = iVar77;
    auVar325._12_4_ = iVar77;
    auVar354._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar354._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar354._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar354._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar307._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar307._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar307._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar307._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar307 = auVar307 & auVar354;
    auVar280 = packssdw(auVar325,auVar307);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._0_4_ >> 0x10 & 1) != 0) {
      str[lVar40 + 2] =
           (cVar118 - ((uVar387 != 0) * (uVar387 < 0x100) * bVar378 - (0xff < uVar387))) + 'a';
    }
    auVar280 = pshufhw(auVar307,auVar307,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    auVar312._8_8_ = lStack_60;
    auVar312._0_8_ = lVar67;
    if ((auVar280._0_4_ >> 0x18 & 1) != 0) {
      str[lVar40 + 3] =
           (cVar119 - ((uVar388 != 0) * (uVar388 < 0x100) * bVar381 - (0xff < uVar388))) + 'a';
    }
    auVar280 = auVar133 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar326._4_4_ = iVar37;
    auVar326._0_4_ = iVar37;
    auVar326._8_4_ = iVar77;
    auVar326._12_4_ = iVar77;
    auVar355._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar355._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar355._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar355._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar308._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar308._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar308._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar308._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar308 = auVar308 & auVar355;
    auVar280 = pshuflw(auVar326,auVar308,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 4] =
           (cVar120 - ((uVar389 != 0) * (uVar389 < 0x100) * bVar384 - (0xff < uVar389))) + 'a';
    }
    auVar280 = packssdw(auVar308,auVar308);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._4_2_ >> 8 & 1) != 0) {
      str[lVar40 + 5] =
           (cVar121 - ((uVar391 != 0) * (uVar391 < 0x100) * (char)uVar390 - (0xff < uVar391))) + 'a'
      ;
    }
    auVar280 = auVar126 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar327._4_4_ = iVar37;
    auVar327._0_4_ = iVar37;
    auVar327._8_4_ = iVar77;
    auVar327._12_4_ = iVar77;
    auVar356._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar356._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar356._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar356._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar309._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar309._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar309._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar309._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar309 = auVar309 & auVar356;
    auVar280 = packssdw(auVar327,auVar309);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 6] =
           (cVar122 - ((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar392 - (0xff < uVar124))) + 'a'
      ;
    }
    auVar280 = pshufhw(auVar309,auVar309,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._6_2_ >> 8 & 1) != 0) {
      str[lVar40 + 7] =
           (cVar123 -
           ((uVar125 != 0) * (uVar125 < 0x100) * (char)(auVar352._14_2_ * 0x1a) - (0xff < uVar125)))
           + 'a';
    }
    auVar280 = auVar103 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar328._4_4_ = iVar37;
    auVar328._0_4_ = iVar37;
    auVar328._8_4_ = iVar77;
    auVar328._12_4_ = iVar77;
    auVar357._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar357._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar357._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar357._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar310._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar310._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar310._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar310._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar310 = auVar310 & auVar357;
    auVar280 = pshuflw(auVar328,auVar310,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40 + 8] =
           (bVar92 - ((uVar299 != 0) * (uVar299 < 0x100) * (char)uVar275 - (0xff < uVar299))) + 'a';
    }
    auVar280 = packssdw(auVar310,auVar310);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._8_2_ >> 8 & 1) != 0) {
      str[lVar40 + 9] =
           (bVar93 - ((uVar301 != 0) * (uVar301 < 0x100) * (char)uVar300 - (0xff < uVar301))) + 'a';
    }
    auVar280 = auVar84 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar329._4_4_ = iVar37;
    auVar329._0_4_ = iVar37;
    auVar329._8_4_ = iVar77;
    auVar329._12_4_ = iVar77;
    auVar358._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar358._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar358._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar358._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar311._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar311._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar311._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar311._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar311 = auVar311 & auVar358;
    auVar280 = packssdw(auVar329,auVar311);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar40 + 10] =
           (bVar94 - ((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar302 - (0xff < uVar303))) + 'a';
    }
    auVar280 = pshufhw(auVar311,auVar311,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._10_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xb] =
           (bVar95 - ((uVar305 != 0) * (uVar305 < 0x100) * (char)uVar304 - (0xff < uVar305))) + 'a';
    }
    auVar312 = auVar312 ^ _DAT_0013f1c0;
    iVar37 = auVar312._0_4_;
    iVar77 = auVar312._8_4_;
    auVar330._4_4_ = iVar37;
    auVar330._0_4_ = iVar37;
    auVar330._8_4_ = iVar77;
    auVar330._12_4_ = iVar77;
    auVar359._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar359._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar359._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar359._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar313._0_4_ = -(uint)(auVar312._4_4_ == -0x80000000);
    auVar313._4_4_ = -(uint)(auVar312._4_4_ == -0x80000000);
    auVar313._8_4_ = -(uint)(auVar312._12_4_ == -0x80000000);
    auVar313._12_4_ = -(uint)(auVar312._12_4_ == -0x80000000);
    auVar313 = auVar313 & auVar359;
    auVar280 = pshuflw(auVar330,auVar313,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xc] =
           (bVar96 - ((uVar342 != 0) * (uVar342 < 0x100) * (char)uVar341 - (0xff < uVar342))) + 'a';
    }
    auVar280 = packssdw(auVar313,auVar313);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._12_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xd] =
           (bVar97 - ((uVar377 != 0) * (uVar377 < 0x100) * (char)uVar376 - (0xff < uVar377))) + 'a';
    }
    auVar280 = auVar59 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar331._4_4_ = iVar37;
    auVar331._0_4_ = iVar37;
    auVar331._8_4_ = iVar77;
    auVar331._12_4_ = iVar77;
    auVar360._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar360._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar360._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar360._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar314._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar314._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar314._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar314._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar314 = auVar314 & auVar360;
    auVar280 = packssdw(auVar331,auVar314);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xe] =
           (bVar98 - ((uVar380 != 0) * (uVar380 < 0x100) * (char)uVar379 - (0xff < uVar380))) + 'a';
    }
    auVar280 = pshufhw(auVar314,auVar314,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._14_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xf] =
           (bVar99 - ((uVar383 != 0) * (uVar383 < 0x100) * (char)uVar382 - (0xff < uVar383))) + 'a';
    }
    lVar40 = lVar40 + 0x10;
    lVar39 = auVar174._8_8_;
    auVar174._0_8_ = auVar174._0_8_ + 0x10;
    auVar174._8_8_ = lVar39 + 0x10;
    lVar39 = auVar154._8_8_;
    auVar154._0_8_ = auVar154._0_8_ + 0x10;
    auVar154._8_8_ = lVar39 + 0x10;
    lVar39 = auVar133._8_8_;
    auVar133._0_8_ = auVar133._0_8_ + 0x10;
    auVar133._8_8_ = lVar39 + 0x10;
    lVar39 = auVar126._8_8_;
    auVar126._0_8_ = auVar126._0_8_ + 0x10;
    auVar126._8_8_ = lVar39 + 0x10;
    lVar39 = auVar103._8_8_;
    auVar103._0_8_ = auVar103._0_8_ + 0x10;
    auVar103._8_8_ = lVar39 + 0x10;
    lVar39 = auVar84._8_8_;
    auVar84._0_8_ = auVar84._0_8_ + 0x10;
    auVar84._8_8_ = lVar39 + 0x10;
    lVar67 = lVar67 + 0x10;
    lVar39 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + 0x10;
    auVar59._8_8_ = lVar39 + 0x10;
    auVar185[0] = auVar185[0] + '\x10';
    auVar185[1] = cVar117 + '\x10';
    auVar185[2] = cVar118 + '\x10';
    auVar185[3] = cVar119 + '\x10';
    auVar185[4] = cVar120 + '\x10';
    auVar185[5] = cVar121 + '\x10';
    auVar185[6] = cVar122 + '\x10';
    auVar185[7] = cVar123 + '\x10';
    auVar185[8] = bVar92 + 0x10;
    auVar185[9] = bVar93 + 0x10;
    auVar185[10] = bVar94 + 0x10;
    auVar185[0xb] = bVar95 + 0x10;
    auVar185[0xc] = bVar96 + 0x10;
    auVar185[0xd] = bVar97 + 0x10;
    auVar185[0xe] = bVar98 + 0x10;
    auVar185[0xf] = bVar99 + 0x10;
    lVar39 = lStack_60 + 0x10;
  } while (lVar40 != 0x100);
  buf[1] = -0x27;
  buf[2] = -2;
  pcVar51 = buf + 3;
  unaff_RBP = str;
  memcpy(buf + 3,str,0xfe);
  pcVar43 = "0xfe == len2";
  _ok(1,"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "len(mp_decode_str(x, %u))",0xfe);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011dbc9:
      uVar36 = (uint)(byte)buf[2];
    }
    else if (uVar36 == 0xc5) {
LAB_0011dbe3:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar51 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011dbd2;
LAB_0011dbfa:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121aec;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011dbe3;
      if (uVar36 != 0xd9) goto LAB_0011dbfa;
      goto LAB_0011dbc9;
    }
LAB_0011dbd2:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "len(mp_decode_strbin(x, %u))",0xfe);
  local_80 = (byte *)(buf + 1);
  iVar45 = 1;
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    local_80 = pbVar38;
    iVar45 = iVar45 + -1;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xfe));
  lVar40 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xfe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "mp_check_str(mp_encode_str(x, 0xfe))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x101),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "len(mp_decode_str(x, 0xfe)");
  _ok((uint)(local_80 == (byte *)(buf + 0x101)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "len(mp_next_str(x, 0xfe)");
  _ok((uint)(local_70 == buf + 0x101),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "len(mp_check_str(x, 0xfe)");
  _ok(1,"mp_sizeof_str(0xfe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "mp_sizeof_str(0xfe)");
  iVar37 = bcmp(str,buf + 3,0xfe);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xfe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x224,
      "mp_encode_str(x, 0xfe) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0xff",0xc,1,_stdout);
  fputc(10,_stdout);
  lVar67 = 0xe;
  auVar70 = _DAT_0013f240;
  auVar85 = _DAT_0013f250;
  auVar104 = _DAT_0013f260;
  auVar127 = _DAT_0013f270;
  auVar134 = _DAT_0013f280;
  auVar155 = _DAT_0013f290;
  auVar175 = _DAT_0013f1b0;
  auVar186 = _DAT_0013f2a0;
  lVar39 = 0xf;
  do {
    lStack_60 = lVar39;
    local_68._0_2_ = (undefined2)lVar67;
    local_68._2_2_ = (undefined2)((ulong)lVar67 >> 0x10);
    uStack_64 = (undefined4)((ulong)lVar67 >> 0x20);
    auVar280 = auVar175 ^ _DAT_0013f1c0;
    auVar332._0_4_ = -(uint)(auVar280._0_4_ < -0x7fffff01);
    auVar332._4_4_ = -(uint)(auVar280._0_4_ < -0x7fffff01);
    auVar332._8_4_ = -(uint)(auVar280._8_4_ < -0x7fffff01);
    auVar332._12_4_ = -(uint)(auVar280._8_4_ < -0x7fffff01);
    auVar315._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar315._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar315._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar315._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar315 = auVar315 & auVar332;
    auVar280 = pshuflw(auVar332,auVar315,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    bVar92 = auVar186[8];
    bVar93 = auVar186[9];
    bVar94 = auVar186[10];
    bVar95 = auVar186[0xb];
    bVar96 = auVar186[0xc];
    bVar97 = auVar186[0xd];
    bVar98 = auVar186[0xe];
    bVar99 = auVar186[0xf];
    uVar275 = (ushort)((ushort)bVar92 * 0x4f) >> 8;
    uVar299 = (ushort)((ushort)bVar93 * 0x4f) >> 8;
    uVar300 = (ushort)((ushort)bVar94 * 0x4f) >> 8;
    uVar301 = (ushort)((ushort)bVar95 * 0x4f) >> 8;
    uVar302 = (ushort)((ushort)bVar96 * 0x4f) >> 8;
    uVar303 = (ushort)((ushort)bVar97 * 0x4f) >> 8;
    uVar304 = (ushort)((ushort)bVar98 * 0x4f) >> 8;
    uVar305 = (ushort)((ushort)bVar99 * 0x4f) >> 8;
    cVar123 = auVar186[7];
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar186._0_13_;
    auVar2[0xe] = cVar123;
    cVar122 = auVar186[6];
    auVar5[0xc] = cVar122;
    auVar5._0_12_ = auVar186._0_12_;
    auVar5._13_2_ = auVar2._13_2_;
    auVar8[0xb] = 0;
    auVar8._0_11_ = auVar186._0_11_;
    auVar8._12_3_ = auVar5._12_3_;
    cVar121 = auVar186[5];
    auVar11[10] = cVar121;
    auVar11._0_10_ = auVar186._0_10_;
    auVar11._11_4_ = auVar8._11_4_;
    auVar14[9] = 0;
    auVar14._0_9_ = auVar186._0_9_;
    auVar14._10_5_ = auVar11._10_5_;
    cVar120 = auVar186[4];
    auVar17[8] = cVar120;
    auVar17._0_8_ = auVar186._0_8_;
    auVar17._9_6_ = auVar14._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar17._8_7_;
    cVar119 = auVar186[3];
    Var24 = CONCAT81(SUB158(auVar26 << 0x40,7),cVar119);
    auVar32._9_6_ = 0;
    auVar32._0_9_ = Var24;
    cVar118 = auVar186[2];
    auVar27._1_10_ = SUB1510(auVar32 << 0x30,5);
    auVar27[0] = cVar118;
    auVar33._11_4_ = 0;
    auVar33._0_11_ = auVar27;
    cVar117 = auVar186[1];
    auVar20[2] = cVar117;
    auVar20._0_2_ = auVar186._0_2_;
    auVar20._3_12_ = SUB1512(auVar33 << 0x20,3);
    uVar341 = (auVar186._0_2_ & 0xff) * 0x4f;
    uVar376 = auVar20._2_2_ * 0x4f;
    uVar379 = auVar27._0_2_ * 0x4f;
    uVar382 = (short)Var24 * 0x4f;
    uVar385 = auVar17._8_2_ * 0x4f;
    uVar387 = auVar11._10_2_ * 0x4f;
    uVar389 = auVar5._12_2_ * 0x4f;
    uVar391 = (auVar2._13_2_ >> 8) * 0x4f;
    uVar342 = uVar341 >> 8;
    uVar377 = uVar376 >> 8;
    uVar380 = uVar379 >> 8;
    uVar383 = uVar382 >> 8;
    uVar386 = uVar385 >> 8;
    uVar388 = uVar387 >> 8;
    uVar390 = uVar389 >> 8;
    uVar392 = uVar391 >> 8;
    uVar341 = CONCAT11((uVar377 != 0) * (uVar377 < 0x100) * (char)(uVar376 >> 8) - (0xff < uVar377),
                       (uVar342 != 0) * (uVar342 < 0x100) * (char)(uVar341 >> 8) - (0xff < uVar342))
    ;
    uVar78 = CONCAT13((uVar383 != 0) * (uVar383 < 0x100) * (char)(uVar382 >> 8) - (0xff < uVar383),
                      CONCAT12((uVar380 != 0) * (uVar380 < 0x100) * (char)(uVar379 >> 8) -
                               (0xff < uVar380),uVar341));
    uVar79 = CONCAT15((uVar388 != 0) * (uVar388 < 0x100) * (char)(uVar387 >> 8) - (0xff < uVar388),
                      CONCAT14((uVar386 != 0) * (uVar386 < 0x100) * (char)(uVar385 >> 8) -
                               (0xff < uVar386),uVar78));
    uVar80 = CONCAT17((uVar392 != 0) * (uVar392 < 0x100) * (char)(uVar391 >> 8) - (0xff < uVar392),
                      CONCAT16((uVar390 != 0) * (uVar390 < 0x100) * (char)(uVar389 >> 8) -
                               (0xff < uVar390),uVar79));
    auVar344._0_10_ =
         CONCAT19((uVar299 != 0) * (uVar299 < 0x100) * (char)((ushort)((ushort)bVar93 * 0x4f) >> 8)
                  - (0xff < uVar299),
                  CONCAT18((uVar275 != 0) * (uVar275 < 0x100) *
                           (char)((ushort)((ushort)bVar92 * 0x4f) >> 8) - (0xff < uVar275),uVar80));
    auVar344[10] = (uVar300 != 0) * (uVar300 < 0x100) * (char)((ushort)((ushort)bVar94 * 0x4f) >> 8)
                   - (0xff < uVar300);
    auVar344[0xb] =
         (uVar301 != 0) * (uVar301 < 0x100) * (char)((ushort)((ushort)bVar95 * 0x4f) >> 8) -
         (0xff < uVar301);
    auVar346[0xc] =
         (uVar302 != 0) * (uVar302 < 0x100) * (char)((ushort)((ushort)bVar96 * 0x4f) >> 8) -
         (0xff < uVar302);
    auVar346._0_12_ = auVar344;
    auVar346[0xd] =
         (uVar303 != 0) * (uVar303 < 0x100) * (char)((ushort)((ushort)bVar97 * 0x4f) >> 8) -
         (0xff < uVar303);
    auVar361[0xe] =
         (uVar304 != 0) * (uVar304 < 0x100) * (char)((ushort)((ushort)bVar98 * 0x4f) >> 8) -
         (0xff < uVar304);
    auVar361._0_14_ = auVar346;
    auVar361[0xf] =
         (uVar305 != 0) * (uVar305 < 0x100) * (char)((ushort)((ushort)bVar99 * 0x4f) >> 8) -
         (0xff < uVar305);
    auVar362._0_2_ = uVar341 >> 3;
    auVar362._2_2_ = (ushort)((uint)uVar78 >> 0x13);
    auVar362._4_2_ = (ushort)((uint6)uVar79 >> 0x23);
    auVar362._6_2_ = (ushort)((ulong)uVar80 >> 0x33);
    auVar362._8_2_ = (ushort)((unkuint10)auVar344._0_10_ >> 0x43);
    auVar362._10_2_ = auVar344._10_2_ >> 3;
    auVar362._12_2_ = auVar346._12_2_ >> 3;
    auVar362._14_2_ = auVar361._14_2_ >> 3;
    auVar362 = auVar362 & _DAT_0013f2d0;
    sVar132 = CONCAT11(auVar362[8],auVar362[8]);
    uVar78 = CONCAT13(auVar362[9],CONCAT12(auVar362[9],sVar132));
    uVar79 = CONCAT15(auVar362[10],CONCAT14(auVar362[10],uVar78));
    uVar80 = CONCAT17(auVar362[0xb],CONCAT16(auVar362[0xb],uVar79));
    auVar277._0_10_ = CONCAT19(auVar362[0xc],CONCAT18(auVar362[0xc],uVar80));
    auVar277[10] = auVar362[0xd];
    auVar277[0xb] = auVar362[0xd];
    auVar279[0xc] = auVar362[0xe];
    auVar279._0_12_ = auVar277;
    auVar279[0xd] = auVar362[0xe];
    auVar282[0xf] = auVar362[0xf];
    auVar282[0xe] = auVar282[0xf];
    auVar282._0_14_ = auVar279;
    uVar275 = sVar132 * 0x1a;
    uVar300 = (short)((uint)uVar78 >> 0x10) * 0x1a;
    uVar302 = (short)((uint6)uVar79 >> 0x20) * 0x1a;
    uVar304 = (short)((ulong)uVar80 >> 0x30) * 0x1a;
    uVar341 = (short)((unkuint10)auVar277._0_10_ >> 0x40) * 0x1a;
    uVar376 = auVar277._10_2_ * 0x1a;
    uVar379 = auVar279._12_2_ * 0x1a;
    uVar382 = auVar282._14_2_ * 0x1a;
    uVar299 = uVar275 & 0xff;
    uVar301 = uVar300 & 0xff;
    uVar303 = uVar302 & 0xff;
    uVar305 = uVar304 & 0xff;
    uVar342 = uVar341 & 0xff;
    uVar377 = uVar376 & 0xff;
    uVar380 = uVar379 & 0xff;
    uVar383 = uVar382 & 0xff;
    auVar367._0_14_ = auVar362._0_14_;
    auVar367[0xe] = auVar362[7];
    auVar367[0xf] = auVar362[7];
    auVar366._14_2_ = auVar367._14_2_;
    auVar366._0_13_ = auVar362._0_13_;
    auVar366[0xd] = auVar362[6];
    auVar365._13_3_ = auVar366._13_3_;
    auVar365._0_12_ = auVar362._0_12_;
    auVar365[0xc] = auVar362[6];
    auVar364._12_4_ = auVar365._12_4_;
    auVar364._0_11_ = auVar362._0_11_;
    auVar364[0xb] = auVar362[5];
    auVar363._11_5_ = auVar364._11_5_;
    auVar363._0_10_ = auVar362._0_10_;
    auVar363[10] = auVar362[5];
    bVar340 = auVar362[0] * '\x1a';
    bVar375 = auVar362[1] * '\x1a';
    bVar378 = auVar362[2] * '\x1a';
    bVar381 = auVar362[3] * '\x1a';
    bVar384 = auVar362[4] * '\x1a';
    uVar390 = auVar363._10_2_ * 0x1a;
    uVar392 = auVar365._12_2_ * 0x1a;
    uVar385 = (ushort)bVar340;
    uVar386 = (ushort)bVar375;
    uVar387 = (ushort)bVar378;
    uVar388 = (ushort)bVar381;
    uVar389 = (ushort)bVar384;
    uVar391 = uVar390 & 0xff;
    uVar124 = uVar392 & 0xff;
    uVar125 = auVar366._14_2_ * 0x1a & 0xff;
    if ((auVar280 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40] = (auVar186[0] - ((uVar385 != 0) * (uVar385 < 0x100) * bVar340 - (0xff < uVar385))
                    ) + 'a';
    }
    auVar280 = packssdw(auVar315,auVar315);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._0_4_ >> 8 & 1) != 0) {
      str[lVar40 + 1] =
           (cVar117 - ((uVar386 != 0) * (uVar386 < 0x100) * bVar375 - (0xff < uVar386))) + 'a';
    }
    auVar280 = auVar155 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar333._4_4_ = iVar37;
    auVar333._0_4_ = iVar37;
    auVar333._8_4_ = iVar77;
    auVar333._12_4_ = iVar77;
    auVar368._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar368._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar368._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar368._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar316._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar316._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar316._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar316._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar316 = auVar316 & auVar368;
    auVar280 = packssdw(auVar333,auVar316);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    auVar322._8_8_ = lStack_60;
    auVar322._0_8_ = lVar67;
    if ((auVar280._0_4_ >> 0x10 & 1) != 0) {
      str[lVar40 + 2] =
           (cVar118 - ((uVar387 != 0) * (uVar387 < 0x100) * bVar378 - (0xff < uVar387))) + 'a';
    }
    auVar280 = pshufhw(auVar316,auVar316,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._0_4_ >> 0x18 & 1) != 0) {
      str[lVar40 + 3] =
           (cVar119 - ((uVar388 != 0) * (uVar388 < 0x100) * bVar381 - (0xff < uVar388))) + 'a';
    }
    auVar280 = auVar134 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar334._4_4_ = iVar37;
    auVar334._0_4_ = iVar37;
    auVar334._8_4_ = iVar77;
    auVar334._12_4_ = iVar77;
    auVar369._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar369._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar369._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar369._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar317._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar317._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar317._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar317._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar317 = auVar317 & auVar369;
    auVar280 = pshuflw(auVar334,auVar317,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 4] =
           (cVar120 - ((uVar389 != 0) * (uVar389 < 0x100) * bVar384 - (0xff < uVar389))) + 'a';
    }
    auVar280 = packssdw(auVar317,auVar317);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._4_2_ >> 8 & 1) != 0) {
      str[lVar40 + 5] =
           (cVar121 - ((uVar391 != 0) * (uVar391 < 0x100) * (char)uVar390 - (0xff < uVar391))) + 'a'
      ;
    }
    auVar280 = auVar127 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar335._4_4_ = iVar37;
    auVar335._0_4_ = iVar37;
    auVar335._8_4_ = iVar77;
    auVar335._12_4_ = iVar77;
    auVar370._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar370._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar370._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar370._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar318._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar318._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar318._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar318._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar318 = auVar318 & auVar370;
    auVar280 = packssdw(auVar335,auVar318);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 6] =
           (cVar122 - ((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar392 - (0xff < uVar124))) + 'a'
      ;
    }
    auVar280 = pshufhw(auVar318,auVar318,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._6_2_ >> 8 & 1) != 0) {
      str[lVar40 + 7] =
           (cVar123 -
           ((uVar125 != 0) * (uVar125 < 0x100) * (char)(auVar366._14_2_ * 0x1a) - (0xff < uVar125)))
           + 'a';
    }
    auVar280 = auVar104 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar336._4_4_ = iVar37;
    auVar336._0_4_ = iVar37;
    auVar336._8_4_ = iVar77;
    auVar336._12_4_ = iVar77;
    auVar371._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar371._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar371._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar371._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar319._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar319._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar319._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar319._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar319 = auVar319 & auVar371;
    auVar280 = pshuflw(auVar336,auVar319,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40 + 8] =
           (bVar92 - ((uVar299 != 0) * (uVar299 < 0x100) * (char)uVar275 - (0xff < uVar299))) + 'a';
    }
    auVar280 = packssdw(auVar319,auVar319);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._8_2_ >> 8 & 1) != 0) {
      str[lVar40 + 9] =
           (bVar93 - ((uVar301 != 0) * (uVar301 < 0x100) * (char)uVar300 - (0xff < uVar301))) + 'a';
    }
    auVar280 = auVar85 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar337._4_4_ = iVar37;
    auVar337._0_4_ = iVar37;
    auVar337._8_4_ = iVar77;
    auVar337._12_4_ = iVar77;
    auVar372._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar372._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar372._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar372._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar320._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar320._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar320._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar320._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar320 = auVar320 & auVar372;
    auVar280 = packssdw(auVar337,auVar320);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar40 + 10] =
           (bVar94 - ((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar302 - (0xff < uVar303))) + 'a';
    }
    auVar280 = pshufhw(auVar320,auVar320,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._10_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xb] =
           (bVar95 - ((uVar305 != 0) * (uVar305 < 0x100) * (char)uVar304 - (0xff < uVar305))) + 'a';
    }
    auVar280 = auVar70 ^ _DAT_0013f1c0;
    iVar37 = auVar280._0_4_;
    iVar77 = auVar280._8_4_;
    auVar338._4_4_ = iVar37;
    auVar338._0_4_ = iVar37;
    auVar338._8_4_ = iVar77;
    auVar338._12_4_ = iVar77;
    auVar373._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar373._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar373._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar373._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar321._0_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar321._4_4_ = -(uint)(auVar280._4_4_ == -0x80000000);
    auVar321._8_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar321._12_4_ = -(uint)(auVar280._12_4_ == -0x80000000);
    auVar321 = auVar321 & auVar373;
    auVar280 = pshuflw(auVar338,auVar321,0xe8);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xc] =
           (bVar96 - ((uVar342 != 0) * (uVar342 < 0x100) * (char)uVar341 - (0xff < uVar342))) + 'a';
    }
    auVar280 = packssdw(auVar321,auVar321);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._12_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xd] =
           (bVar97 - ((uVar377 != 0) * (uVar377 < 0x100) * (char)uVar376 - (0xff < uVar377))) + 'a';
    }
    auVar322 = auVar322 ^ _DAT_0013f1c0;
    iVar37 = auVar322._0_4_;
    iVar77 = auVar322._8_4_;
    auVar339._4_4_ = iVar37;
    auVar339._0_4_ = iVar37;
    auVar339._8_4_ = iVar77;
    auVar339._12_4_ = iVar77;
    auVar374._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar374._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar374._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar374._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar323._0_4_ = -(uint)(auVar322._4_4_ == -0x80000000);
    auVar323._4_4_ = -(uint)(auVar322._4_4_ == -0x80000000);
    auVar323._8_4_ = -(uint)(auVar322._12_4_ == -0x80000000);
    auVar323._12_4_ = -(uint)(auVar322._12_4_ == -0x80000000);
    auVar323 = auVar323 & auVar374;
    auVar280 = packssdw(auVar339,auVar323);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xe] =
           (bVar98 - ((uVar380 != 0) * (uVar380 < 0x100) * (char)uVar379 - (0xff < uVar380))) + 'a';
    }
    auVar280 = pshufhw(auVar323,auVar323,0x84);
    auVar280 = packssdw(auVar280,auVar280);
    auVar280 = packsswb(auVar280,auVar280);
    if ((auVar280._14_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xf] =
           (bVar99 - ((uVar383 != 0) * (uVar383 < 0x100) * (char)uVar382 - (0xff < uVar383))) + 'a';
    }
    lVar40 = lVar40 + 0x10;
    lVar39 = auVar175._8_8_;
    auVar175._0_8_ = auVar175._0_8_ + 0x10;
    auVar175._8_8_ = lVar39 + 0x10;
    lVar39 = auVar155._8_8_;
    auVar155._0_8_ = auVar155._0_8_ + 0x10;
    auVar155._8_8_ = lVar39 + 0x10;
    lVar39 = auVar134._8_8_;
    auVar134._0_8_ = auVar134._0_8_ + 0x10;
    auVar134._8_8_ = lVar39 + 0x10;
    lVar39 = auVar127._8_8_;
    auVar127._0_8_ = auVar127._0_8_ + 0x10;
    auVar127._8_8_ = lVar39 + 0x10;
    lVar39 = auVar104._8_8_;
    auVar104._0_8_ = auVar104._0_8_ + 0x10;
    auVar104._8_8_ = lVar39 + 0x10;
    lVar39 = auVar85._8_8_;
    auVar85._0_8_ = auVar85._0_8_ + 0x10;
    auVar85._8_8_ = lVar39 + 0x10;
    lVar39 = auVar70._8_8_;
    auVar70._0_8_ = auVar70._0_8_ + 0x10;
    auVar70._8_8_ = lVar39 + 0x10;
    lVar67 = lVar67 + 0x10;
    auVar186[0] = auVar186[0] + '\x10';
    auVar186[1] = cVar117 + '\x10';
    auVar186[2] = cVar118 + '\x10';
    auVar186[3] = cVar119 + '\x10';
    auVar186[4] = cVar120 + '\x10';
    auVar186[5] = cVar121 + '\x10';
    auVar186[6] = cVar122 + '\x10';
    auVar186[7] = cVar123 + '\x10';
    auVar186[8] = bVar92 + 0x10;
    auVar186[9] = bVar93 + 0x10;
    auVar186[10] = bVar94 + 0x10;
    auVar186[0xb] = bVar95 + 0x10;
    auVar186[0xc] = bVar96 + 0x10;
    auVar186[0xd] = bVar97 + 0x10;
    auVar186[0xe] = bVar98 + 0x10;
    auVar186[0xf] = bVar99 + 0x10;
    lVar39 = lStack_60 + 0x10;
  } while (lVar40 != 0x100);
  buf[1] = -0x27;
  buf[2] = -1;
  pcVar51 = buf + 3;
  memcpy(buf + 3,str,0xff);
  pcVar43 = "0xff == len2";
  _ok(1,"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "len(mp_decode_str(x, %u))",0xff);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011e3c0:
      uVar36 = (uint)(byte)buf[2];
    }
    else if (uVar36 == 0xc5) {
LAB_0011e3da:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar51 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011e3c9;
LAB_0011e3f1:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121af1;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011e3da;
      if (uVar36 != 0xd9) goto LAB_0011e3f1;
      goto LAB_0011e3c0;
    }
LAB_0011e3c9:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  unaff_RBP = pcVar51 + uVar36;
  _ok((uint)(uVar36 == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "len(mp_decode_strbin(x, %u))",0xff);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xff));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "mp_check_str(mp_encode_str(x, 0xff))");
  _ok((uint)(unaff_RBP == buf + 0x102),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "len(mp_decode_str(x, 0xff)");
  _ok((uint)(local_80 == (byte *)(buf + 0x102)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "len(mp_next_str(x, 0xff)");
  _ok((uint)(local_70 == buf + 0x102),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "len(mp_check_str(x, 0xff)");
  _ok(1,"mp_sizeof_str(0xff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "mp_sizeof_str(0xff)");
  pcVar51 = buf + 3;
  iVar37 = bcmp(str,buf + 3,0xff);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x225,
      "mp_encode_str(x, 0xff) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0x100",0xd,1,_stdout);
  fputc(10,_stdout);
  auVar176 = _DAT_0013f320;
  auVar280 = _DAT_0013f2d0;
  auVar60 = _DAT_0013f2a0;
  do {
    bVar92 = auVar60[8];
    bVar93 = auVar60[9];
    bVar94 = auVar60[10];
    bVar95 = auVar60[0xb];
    bVar96 = auVar60[0xc];
    bVar97 = auVar60[0xd];
    bVar98 = auVar60[0xe];
    bVar99 = auVar60[0xf];
    uVar275 = (ushort)((ushort)bVar92 * 0x4f) >> 8;
    uVar299 = (ushort)((ushort)bVar93 * 0x4f) >> 8;
    uVar300 = (ushort)((ushort)bVar94 * 0x4f) >> 8;
    uVar301 = (ushort)((ushort)bVar95 * 0x4f) >> 8;
    uVar302 = (ushort)((ushort)bVar96 * 0x4f) >> 8;
    uVar303 = (ushort)((ushort)bVar97 * 0x4f) >> 8;
    uVar304 = (ushort)((ushort)bVar98 * 0x4f) >> 8;
    uVar305 = (ushort)((ushort)bVar99 * 0x4f) >> 8;
    cVar123 = auVar60[7];
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar60._0_13_;
    auVar3[0xe] = cVar123;
    cVar122 = auVar60[6];
    auVar6[0xc] = cVar122;
    auVar6._0_12_ = auVar60._0_12_;
    auVar6._13_2_ = auVar3._13_2_;
    auVar9[0xb] = 0;
    auVar9._0_11_ = auVar60._0_11_;
    auVar9._12_3_ = auVar6._12_3_;
    cVar121 = auVar60[5];
    auVar12[10] = cVar121;
    auVar12._0_10_ = auVar60._0_10_;
    auVar12._11_4_ = auVar9._11_4_;
    auVar15[9] = 0;
    auVar15._0_9_ = auVar60._0_9_;
    auVar15._10_5_ = auVar12._10_5_;
    cVar120 = auVar60[4];
    auVar18[8] = cVar120;
    auVar18._0_8_ = auVar60._0_8_;
    auVar18._9_6_ = auVar15._9_6_;
    auVar28._7_8_ = 0;
    auVar28._0_7_ = auVar18._8_7_;
    cVar119 = auVar60[3];
    Var24 = CONCAT81(SUB158(auVar28 << 0x40,7),cVar119);
    auVar34._9_6_ = 0;
    auVar34._0_9_ = Var24;
    cVar118 = auVar60[2];
    auVar29._1_10_ = SUB1510(auVar34 << 0x30,5);
    auVar29[0] = cVar118;
    auVar35._11_4_ = 0;
    auVar35._0_11_ = auVar29;
    cVar117 = auVar60[1];
    auVar21[2] = cVar117;
    auVar21._0_2_ = auVar60._0_2_;
    auVar21._3_12_ = SUB1512(auVar35 << 0x20,3);
    uVar341 = (auVar60._0_2_ & 0xff) * 0x4f;
    uVar376 = auVar21._2_2_ * 0x4f;
    uVar379 = auVar29._0_2_ * 0x4f;
    uVar382 = (short)Var24 * 0x4f;
    uVar385 = auVar18._8_2_ * 0x4f;
    uVar387 = auVar12._10_2_ * 0x4f;
    uVar389 = auVar6._12_2_ * 0x4f;
    uVar391 = (auVar3._13_2_ >> 8) * 0x4f;
    uVar342 = uVar341 >> 8;
    uVar377 = uVar376 >> 8;
    uVar380 = uVar379 >> 8;
    uVar383 = uVar382 >> 8;
    uVar386 = uVar385 >> 8;
    uVar388 = uVar387 >> 8;
    uVar390 = uVar389 >> 8;
    uVar392 = uVar391 >> 8;
    uVar341 = CONCAT11((uVar377 != 0) * (uVar377 < 0x100) * (char)(uVar376 >> 8) - (0xff < uVar377),
                       (uVar342 != 0) * (uVar342 < 0x100) * (char)(uVar341 >> 8) - (0xff < uVar342))
    ;
    uVar78 = CONCAT13((uVar383 != 0) * (uVar383 < 0x100) * (char)(uVar382 >> 8) - (0xff < uVar383),
                      CONCAT12((uVar380 != 0) * (uVar380 < 0x100) * (char)(uVar379 >> 8) -
                               (0xff < uVar380),uVar341));
    uVar79 = CONCAT15((uVar388 != 0) * (uVar388 < 0x100) * (char)(uVar387 >> 8) - (0xff < uVar388),
                      CONCAT14((uVar386 != 0) * (uVar386 < 0x100) * (char)(uVar385 >> 8) -
                               (0xff < uVar386),uVar78));
    uVar80 = CONCAT17((uVar392 != 0) * (uVar392 < 0x100) * (char)(uVar391 >> 8) - (0xff < uVar392),
                      CONCAT16((uVar390 != 0) * (uVar390 < 0x100) * (char)(uVar389 >> 8) -
                               (0xff < uVar390),uVar79));
    auVar101._0_10_ =
         CONCAT19((uVar299 != 0) * (uVar299 < 0x100) * (char)((ushort)((ushort)bVar93 * 0x4f) >> 8)
                  - (0xff < uVar299),
                  CONCAT18((uVar275 != 0) * (uVar275 < 0x100) *
                           (char)((ushort)((ushort)bVar92 * 0x4f) >> 8) - (0xff < uVar275),uVar80));
    auVar101[10] = (uVar300 != 0) * (uVar300 < 0x100) * (char)((ushort)((ushort)bVar94 * 0x4f) >> 8)
                   - (0xff < uVar300);
    auVar101[0xb] =
         (uVar301 != 0) * (uVar301 < 0x100) * (char)((ushort)((ushort)bVar95 * 0x4f) >> 8) -
         (0xff < uVar301);
    auVar102[0xc] =
         (uVar302 != 0) * (uVar302 < 0x100) * (char)((ushort)((ushort)bVar96 * 0x4f) >> 8) -
         (0xff < uVar302);
    auVar102._0_12_ = auVar101;
    auVar102[0xd] =
         (uVar303 != 0) * (uVar303 < 0x100) * (char)((ushort)((ushort)bVar97 * 0x4f) >> 8) -
         (0xff < uVar303);
    auVar105[0xe] =
         (uVar304 != 0) * (uVar304 < 0x100) * (char)((ushort)((ushort)bVar98 * 0x4f) >> 8) -
         (0xff < uVar304);
    auVar105._0_14_ = auVar102;
    auVar105[0xf] =
         (uVar305 != 0) * (uVar305 < 0x100) * (char)((ushort)((ushort)bVar99 * 0x4f) >> 8) -
         (0xff < uVar305);
    auVar106._0_2_ = uVar341 >> 3;
    auVar106._2_2_ = (ushort)((uint)uVar78 >> 0x13);
    auVar106._4_2_ = (ushort)((uint6)uVar79 >> 0x23);
    auVar106._6_2_ = (ushort)((ulong)uVar80 >> 0x33);
    auVar106._8_2_ = (ushort)((unkuint10)auVar101._0_10_ >> 0x43);
    auVar106._10_2_ = auVar101._10_2_ >> 3;
    auVar106._12_2_ = auVar102._12_2_ >> 3;
    auVar106._14_2_ = auVar105._14_2_ >> 3;
    auVar106 = auVar106 & auVar280;
    sVar132 = CONCAT11(auVar106[8],auVar106[8]);
    uVar78 = CONCAT13(auVar106[9],CONCAT12(auVar106[9],sVar132));
    uVar79 = CONCAT15(auVar106[10],CONCAT14(auVar106[10],uVar78));
    uVar80 = CONCAT17(auVar106[0xb],CONCAT16(auVar106[0xb],uVar79));
    auVar81._0_10_ = CONCAT19(auVar106[0xc],CONCAT18(auVar106[0xc],uVar80));
    auVar81[10] = auVar106[0xd];
    auVar81[0xb] = auVar106[0xd];
    auVar82[0xc] = auVar106[0xe];
    auVar82._0_12_ = auVar81;
    auVar82[0xd] = auVar106[0xe];
    auVar86[0xf] = auVar106[0xf];
    auVar86[0xe] = auVar86[0xf];
    auVar86._0_14_ = auVar82;
    uVar275 = sVar132 * 0x1a;
    uVar300 = (short)((uint)uVar78 >> 0x10) * 0x1a;
    uVar302 = (short)((uint6)uVar79 >> 0x20) * 0x1a;
    uVar304 = (short)((ulong)uVar80 >> 0x30) * 0x1a;
    uVar341 = (short)((unkuint10)auVar81._0_10_ >> 0x40) * 0x1a;
    uVar376 = auVar81._10_2_ * 0x1a;
    uVar379 = auVar82._12_2_ * 0x1a;
    uVar382 = auVar86._14_2_ * 0x1a;
    uVar299 = uVar275 & 0xff;
    uVar301 = uVar300 & 0xff;
    uVar303 = uVar302 & 0xff;
    uVar305 = uVar304 & 0xff;
    uVar342 = uVar341 & 0xff;
    uVar377 = uVar376 & 0xff;
    uVar380 = uVar379 & 0xff;
    uVar383 = uVar382 & 0xff;
    auVar111._0_14_ = auVar106._0_14_;
    auVar111[0xe] = auVar106[7];
    auVar111[0xf] = auVar106[7];
    auVar110._14_2_ = auVar111._14_2_;
    auVar110._0_13_ = auVar106._0_13_;
    auVar110[0xd] = auVar106[6];
    auVar109._13_3_ = auVar110._13_3_;
    auVar109._0_12_ = auVar106._0_12_;
    auVar109[0xc] = auVar106[6];
    auVar108._12_4_ = auVar109._12_4_;
    auVar108._0_11_ = auVar106._0_11_;
    auVar108[0xb] = auVar106[5];
    auVar107._11_5_ = auVar108._11_5_;
    auVar107._0_10_ = auVar106._0_10_;
    auVar107[10] = auVar106[5];
    bVar340 = auVar106[0] * '\x1a';
    bVar375 = auVar106[1] * '\x1a';
    bVar378 = auVar106[2] * '\x1a';
    bVar381 = auVar106[3] * '\x1a';
    bVar384 = auVar106[4] * '\x1a';
    uVar390 = auVar107._10_2_ * 0x1a;
    uVar392 = auVar109._12_2_ * 0x1a;
    uVar385 = (ushort)bVar340;
    uVar386 = (ushort)bVar375;
    uVar387 = (ushort)bVar378;
    uVar388 = (ushort)bVar381;
    uVar389 = (ushort)bVar384;
    uVar391 = uVar390 & 0xff;
    uVar124 = uVar392 & 0xff;
    uVar125 = auVar110._14_2_ * 0x1a & 0xff;
    str[lVar39] = (auVar60[0] - ((uVar385 != 0) * (uVar385 < 0x100) * bVar340 - (0xff < uVar385))) +
                  'a';
    str[lVar39 + 1] =
         (cVar117 - ((uVar386 != 0) * (uVar386 < 0x100) * bVar375 - (0xff < uVar386))) + 'a';
    str[lVar39 + 2] =
         (cVar118 - ((uVar387 != 0) * (uVar387 < 0x100) * bVar378 - (0xff < uVar387))) + 'a';
    str[lVar39 + 3] =
         (cVar119 - ((uVar388 != 0) * (uVar388 < 0x100) * bVar381 - (0xff < uVar388))) + 'a';
    str[lVar39 + 4] =
         (cVar120 - ((uVar389 != 0) * (uVar389 < 0x100) * bVar384 - (0xff < uVar389))) + 'a';
    str[lVar39 + 5] =
         (cVar121 - ((uVar391 != 0) * (uVar391 < 0x100) * (char)uVar390 - (0xff < uVar391))) + 'a';
    str[lVar39 + 6] =
         (cVar122 - ((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar392 - (0xff < uVar124))) + 'a';
    str[lVar39 + 7] =
         (cVar123 -
         ((uVar125 != 0) * (uVar125 < 0x100) * (char)(auVar110._14_2_ * 0x1a) - (0xff < uVar125))) +
         'a';
    str[lVar39 + 8] =
         (bVar92 - ((uVar299 != 0) * (uVar299 < 0x100) * (char)uVar275 - (0xff < uVar299))) + 'a';
    str[lVar39 + 9] =
         (bVar93 - ((uVar301 != 0) * (uVar301 < 0x100) * (char)uVar300 - (0xff < uVar301))) + 'a';
    str[lVar39 + 10] =
         (bVar94 - ((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar302 - (0xff < uVar303))) + 'a';
    str[lVar39 + 0xb] =
         (bVar95 - ((uVar305 != 0) * (uVar305 < 0x100) * (char)uVar304 - (0xff < uVar305))) + 'a';
    str[lVar39 + 0xc] =
         (bVar96 - ((uVar342 != 0) * (uVar342 < 0x100) * (char)uVar341 - (0xff < uVar342))) + 'a';
    str[lVar39 + 0xd] =
         (bVar97 - ((uVar377 != 0) * (uVar377 < 0x100) * (char)uVar376 - (0xff < uVar377))) + 'a';
    str[lVar39 + 0xe] =
         (bVar98 - ((uVar380 != 0) * (uVar380 < 0x100) * (char)uVar379 - (0xff < uVar380))) + 'a';
    str[lVar39 + 0xf] =
         (bVar99 - ((uVar383 != 0) * (uVar383 < 0x100) * (char)uVar382 - (0xff < uVar383))) + 'a';
    lVar39 = lVar39 + 0x10;
    auVar60[0] = auVar60[0] + auVar176[0];
    auVar60[1] = cVar117 + auVar176[1];
    auVar60[2] = cVar118 + auVar176[2];
    auVar60[3] = cVar119 + auVar176[3];
    auVar60[4] = cVar120 + auVar176[4];
    auVar60[5] = cVar121 + auVar176[5];
    auVar60[6] = cVar122 + auVar176[6];
    auVar60[7] = cVar123 + auVar176[7];
    auVar60[8] = bVar92 + auVar176[8];
    auVar60[9] = bVar93 + auVar176[9];
    auVar60[10] = bVar94 + auVar176[10];
    auVar60[0xb] = bVar95 + auVar176[0xb];
    auVar60[0xc] = bVar96 + auVar176[0xc];
    auVar60[0xd] = bVar97 + auVar176[0xd];
    auVar60[0xe] = bVar98 + auVar176[0xe];
    auVar60[0xf] = bVar99 + auVar176[0xf];
  } while (lVar39 != 0x100);
  buf[1] = -0x26;
  buf[2] = '\x01';
  buf[3] = '\0';
  memcpy(buf + 4,str,0x100);
  pcVar43 = "0x100 == len2";
  _ok(1,"0x100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "len(mp_decode_str(x, %u))",0x100);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011e762:
      uVar36 = (uint)(byte)buf[2];
    }
    else if (uVar36 == 0xc5) {
LAB_0011e77c:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar51 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011e76b;
LAB_0011e78f:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121af6;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011e77c;
      if (uVar36 != 0xd9) goto LAB_0011e78f;
      goto LAB_0011e762;
    }
LAB_0011e76b:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x100),"0x100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "len(mp_decode_strbin(x, %u))",0x100);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x100));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x100)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "mp_check_str(mp_encode_str(x, 0x100))");
  unaff_RBP = buf + 0x104;
  _ok((uint)(pcVar51 + uVar36 == buf + 0x104),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "len(mp_decode_str(x, 0x100)");
  _ok((uint)(local_80 == (byte *)(buf + 0x104)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "len(mp_next_str(x, 0x100)");
  _ok((uint)(local_70 == buf + 0x104),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "len(mp_check_str(x, 0x100)");
  _ok(1,"mp_sizeof_str(0x100) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "mp_sizeof_str(0x100)");
  iVar37 = bcmp(str,buf + 4,0x100);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x100) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x226,
      "mp_encode_str(x, 0x100) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0x101",0xd,1,_stdout);
  fputc(10,_stdout);
  auVar280 = _DAT_0013f1c0;
  uVar275 = 7;
  uVar299 = 6;
  uVar300 = 5;
  uVar301 = 4;
  uVar302 = 3;
  uVar303 = 2;
  uVar304 = 1;
  auVar61 = _DAT_0013f270;
  auVar71 = _DAT_0013f280;
  auVar87 = _DAT_0013f290;
  auVar112 = _DAT_0013f1b0;
  do {
    auVar176 = auVar112 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar187._4_4_ = iVar37;
    auVar187._0_4_ = iVar37;
    auVar187._8_4_ = iVar77;
    auVar187._12_4_ = iVar77;
    auVar207._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar207._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar207._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar207._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar177._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar177._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar177._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar177._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar177 = auVar177 & auVar207;
    auVar176 = pshuflw(auVar187,auVar177,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    cVar117 = (char)lVar39;
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39] = ((char)(((uint)lVar39 & 0xffff) / 0x1a) * -0x1a + 0x60U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar177,auVar177);
    auVar176 = packssdw(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x10 & 1) != 0) {
      str[lVar39 + 1] = (char)(uVar304 / 0x1a) * -0x1a + 'b' + cVar117;
    }
    auVar176 = auVar87 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar188._4_4_ = iVar37;
    auVar188._0_4_ = iVar37;
    auVar188._8_4_ = iVar77;
    auVar188._12_4_ = iVar77;
    auVar208._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar208._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar208._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar208._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar178._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar178._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar178._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar178._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar178 = auVar178 & auVar208;
    auVar176 = packssdw(auVar188,auVar178);
    auVar176 = packssdw(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 2] = ((char)(uVar303 / 0x1a) * -0x1a + 0x62U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar178,auVar178,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 3] = (char)(uVar302 / 0x1a) * -0x1a + 'd' + cVar117;
    }
    auVar176 = auVar71 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar189._4_4_ = iVar37;
    auVar189._0_4_ = iVar37;
    auVar189._8_4_ = iVar77;
    auVar189._12_4_ = iVar77;
    auVar209._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar209._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar209._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar209._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar179._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar179._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar179._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar179._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar179 = auVar179 & auVar209;
    auVar176 = pshuflw(auVar189,auVar179,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39 + 4] = ((char)(uVar301 / 0x1a) * -0x1a + 100U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar179,auVar179);
    auVar176 = packssdw(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar39 + 5] = (char)(uVar300 / 0x1a) * -0x1a + 'f' + cVar117;
    }
    auVar176 = auVar61 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar190._4_4_ = iVar37;
    auVar190._0_4_ = iVar37;
    auVar190._8_4_ = iVar77;
    auVar190._12_4_ = iVar77;
    auVar210._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar210._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar210._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar210._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar180._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar180._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar180._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar180._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar180 = auVar180 & auVar210;
    auVar176 = packssdw(auVar190,auVar180);
    auVar176 = packssdw(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 6] = ((char)(uVar299 / 0x1a) * -0x1a + 0x66U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar180,auVar180,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 7] = (char)(uVar275 / 0x1a) * -0x1a + 'h' + cVar117;
    }
    lVar39 = lVar39 + 8;
    lVar40 = auVar112._8_8_;
    auVar112._0_8_ = auVar112._0_8_ + 8;
    auVar112._8_8_ = lVar40 + 8;
    lVar40 = auVar87._8_8_;
    auVar87._0_8_ = auVar87._0_8_ + 8;
    auVar87._8_8_ = lVar40 + 8;
    lVar40 = auVar71._8_8_;
    auVar71._0_8_ = auVar71._0_8_ + 8;
    auVar71._8_8_ = lVar40 + 8;
    lVar40 = auVar61._8_8_;
    auVar61._0_8_ = auVar61._0_8_ + 8;
    auVar61._8_8_ = lVar40 + 8;
    uVar275 = uVar275 + 8;
    uVar299 = uVar299 + 8;
    uVar300 = uVar300 + 8;
    uVar301 = uVar301 + 8;
    uVar302 = uVar302 + 8;
    uVar303 = uVar303 + 8;
    uVar304 = uVar304 + 8;
  } while (lVar39 != 0x108);
  buf[1] = -0x26;
  buf[2] = '\x01';
  buf[3] = '\x01';
  pcVar51 = buf + 4;
  memcpy(buf + 4,str,0x101);
  pcVar43 = "0x101 == len2";
  _ok(1,"0x101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "len(mp_decode_str(x, %u))",0x101);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011ed9c:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0011edbd:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011edac;
LAB_0011edcd:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121afb;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011edbd;
      if (uVar36 != 0xd9) goto LAB_0011edcd;
      goto LAB_0011ed9c;
    }
LAB_0011edac:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x101),"0x101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "len(mp_decode_strbin(x, %u))",0x101);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x101));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x101)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "mp_check_str(mp_encode_str(x, 0x101))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x105),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "len(mp_decode_str(x, 0x101)");
  _ok((uint)(local_80 == (byte *)(buf + 0x105)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "len(mp_next_str(x, 0x101)");
  _ok((uint)(local_70 == buf + 0x105),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "len(mp_check_str(x, 0x101)");
  _ok(1,"mp_sizeof_str(0x101) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "mp_sizeof_str(0x101)");
  iVar37 = bcmp(str,buf + 4,0x101);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x101) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x227,
      "mp_encode_str(x, 0x101) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0xfffe",0xe,1,_stdout);
  iVar37 = fputc(10,_stdout);
  auVar280 = _DAT_0013f1c0;
  uVar275 = (ushort)((uint)iVar37 >> 0x10);
  local_68 = CONCAT22(uVar275,0xf);
  local_74 = CONCAT22(uVar275,0xe);
  local_78 = (uint)CONCAT62((uint6)uVar275,0xd);
  uVar300 = 0xc;
  uVar301 = 0xb;
  uVar302 = 10;
  uVar303 = 9;
  uVar304 = 8;
  uVar305 = 7;
  uVar376 = 6;
  uVar341 = 5;
  uVar36 = 4;
  uVar342 = 3;
  uVar299 = 2;
  uVar275 = 1;
  auVar62 = _DAT_0013f230;
  auVar72 = _DAT_0013f240;
  auVar88 = _DAT_0013f250;
  auVar113 = _DAT_0013f260;
  auVar128 = _DAT_0013f270;
  auVar135 = _DAT_0013f280;
  auVar156 = _DAT_0013f290;
  auVar181 = _DAT_0013f1b0;
  do {
    auVar176 = auVar181 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar211._4_4_ = iVar37;
    auVar211._0_4_ = iVar37;
    auVar211._8_4_ = iVar77;
    auVar211._12_4_ = iVar77;
    auVar227._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar227._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar227._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar227._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar191._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar191._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar191._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar191._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar191 = auVar191 & auVar227;
    auVar176 = pshuflw(auVar211,auVar191,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    cVar117 = (char)lVar39;
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39] = ((char)(((uint)lVar39 & 0xffff) / 0x1a) * -0x1a + 0x60U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar191,auVar191);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 8 & 1) != 0) {
      str[lVar39 + 1] = (char)(uVar275 / 0x1a) * -0x1a + 'b' + cVar117;
    }
    auVar176 = auVar156 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar212._4_4_ = iVar37;
    auVar212._0_4_ = iVar37;
    auVar212._8_4_ = iVar77;
    auVar212._12_4_ = iVar77;
    auVar228._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar228._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar228._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar228._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar192._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar192._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar192._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar192._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar192 = auVar192 & auVar228;
    auVar176 = packssdw(auVar212,auVar192);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x10 & 1) != 0) {
      str[lVar39 + 2] = ((char)(uVar299 / 0x1a) * -0x1a + 0x62U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar192,auVar192,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x18 & 1) != 0) {
      str[lVar39 + 3] = (char)(uVar342 / 0x1a) * -0x1a + 'd' + cVar117;
    }
    auVar176 = auVar135 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar213._4_4_ = iVar37;
    auVar213._0_4_ = iVar37;
    auVar213._8_4_ = iVar77;
    auVar213._12_4_ = iVar77;
    auVar229._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar229._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar229._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar229._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar193._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar193._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar193._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar193._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar193 = auVar193 & auVar229;
    auVar176 = pshuflw(auVar213,auVar193,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 4] = ((char)((uVar36 & 0xffff) / 0x1a) * -0x1a + 100U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar193,auVar193);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._4_2_ >> 8 & 1) != 0) {
      str[lVar39 + 5] = (char)(uVar341 / 0x1a) * -0x1a + 'f' + cVar117;
    }
    auVar176 = auVar128 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar214._4_4_ = iVar37;
    auVar214._0_4_ = iVar37;
    auVar214._8_4_ = iVar77;
    auVar214._12_4_ = iVar77;
    auVar230._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar230._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar230._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar230._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar194._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar194._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar194._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar194._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar194 = auVar194 & auVar230;
    auVar176 = packssdw(auVar214,auVar194);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 6] = ((char)(uVar376 / 0x1a) * -0x1a + 0x66U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar194,auVar194,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._6_2_ >> 8 & 1) != 0) {
      str[lVar39 + 7] = (char)(uVar305 / 0x1a) * -0x1a + 'h' + cVar117;
    }
    auVar176 = auVar113 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar215._4_4_ = iVar37;
    auVar215._0_4_ = iVar37;
    auVar215._8_4_ = iVar77;
    auVar215._12_4_ = iVar77;
    auVar231._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar231._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar231._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar231._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar195._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar195._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar195._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar195._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar195 = auVar195 & auVar231;
    auVar176 = pshuflw(auVar215,auVar195,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39 + 8] = ((char)(uVar304 / 0x1a) * -0x1a + 0x68U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar195,auVar195);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._8_2_ >> 8 & 1) != 0) {
      str[lVar39 + 9] = (char)(uVar303 / 0x1a) * -0x1a + 'j' + cVar117;
    }
    auVar176 = auVar88 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar216._4_4_ = iVar37;
    auVar216._0_4_ = iVar37;
    auVar216._8_4_ = iVar77;
    auVar216._12_4_ = iVar77;
    auVar232._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar232._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar232._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar232._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar196._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar196._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar196._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar196._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar196 = auVar196 & auVar232;
    auVar176 = packssdw(auVar216,auVar196);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar39 + 10] = ((char)(uVar302 / 0x1a) * -0x1a + 0x6aU | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar196,auVar196,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._10_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xb] = (char)(uVar301 / 0x1a) * -0x1a + 'l' + cVar117;
    }
    auVar176 = auVar72 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar217._4_4_ = iVar37;
    auVar217._0_4_ = iVar37;
    auVar217._8_4_ = iVar77;
    auVar217._12_4_ = iVar77;
    auVar233._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar233._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar233._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar233._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar197._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar197._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar197._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar197._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar197 = auVar197 & auVar233;
    auVar176 = pshuflw(auVar217,auVar197,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xc] = ((char)(uVar300 / 0x1a) * -0x1a + 0x6cU | 1) + cVar117;
    }
    auVar176 = packssdw(auVar197,auVar197);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._12_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xd] = (char)((local_78 & 0xffff) / 0x1a) * -0x1a + 'n' + cVar117;
    }
    auVar176 = auVar62 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar218._4_4_ = iVar37;
    auVar218._0_4_ = iVar37;
    auVar218._8_4_ = iVar77;
    auVar218._12_4_ = iVar77;
    auVar234._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar234._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar234._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar234._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar198._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar198._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar198._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar198._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar198 = auVar198 & auVar234;
    auVar176 = packssdw(auVar218,auVar198);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xe] = ((char)((local_74 & 0xffff) / 0x1a) * -0x1a + 0x6eU | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar198,auVar198,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._14_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xf] = (char)((local_68 & 0xffff) / 0x1a) * -0x1a + 'p' + cVar117;
    }
    lVar39 = lVar39 + 0x10;
    lVar40 = auVar181._8_8_;
    auVar181._0_8_ = auVar181._0_8_ + 0x10;
    auVar181._8_8_ = lVar40 + 0x10;
    lVar40 = auVar156._8_8_;
    auVar156._0_8_ = auVar156._0_8_ + 0x10;
    auVar156._8_8_ = lVar40 + 0x10;
    lVar40 = auVar135._8_8_;
    auVar135._0_8_ = auVar135._0_8_ + 0x10;
    auVar135._8_8_ = lVar40 + 0x10;
    lVar40 = auVar128._8_8_;
    auVar128._0_8_ = auVar128._0_8_ + 0x10;
    auVar128._8_8_ = lVar40 + 0x10;
    lVar40 = auVar113._8_8_;
    auVar113._0_8_ = auVar113._0_8_ + 0x10;
    auVar113._8_8_ = lVar40 + 0x10;
    lVar40 = auVar88._8_8_;
    auVar88._0_8_ = auVar88._0_8_ + 0x10;
    auVar88._8_8_ = lVar40 + 0x10;
    lVar40 = auVar72._8_8_;
    auVar72._0_8_ = auVar72._0_8_ + 0x10;
    auVar72._8_8_ = lVar40 + 0x10;
    lVar40 = auVar62._8_8_;
    auVar62._0_8_ = auVar62._0_8_ + 0x10;
    auVar62._8_8_ = lVar40 + 0x10;
    local_68 = local_68 + 0x10;
    local_74 = local_74 + 0x10;
    local_78 = local_78 + 0x10;
    uVar300 = uVar300 + 0x10;
    uVar301 = uVar301 + 0x10;
    uVar302 = uVar302 + 0x10;
    uVar303 = uVar303 + 0x10;
    uVar304 = uVar304 + 0x10;
    uVar305 = uVar305 + 0x10;
    uVar376 = uVar376 + 0x10;
    uVar341 = uVar341 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar342 = uVar342 + 0x10;
    uVar299 = uVar299 + 0x10;
    uVar275 = uVar275 + 0x10;
  } while (lVar39 != 0x10000);
  local_58 = -0x80000000;
  iStack_54 = -0x80000000;
  iStack_50 = -0x80000000;
  iStack_4c = -0x80000000;
  local_48 = -0x7fff0002;
  iStack_44 = -0x7fff0002;
  iStack_40 = -0x7fff0002;
  iStack_3c = -0x7fff0002;
  buf[1] = -0x26;
  buf[2] = -1;
  buf[3] = -2;
  pcVar51 = buf + 4;
  memcpy(buf + 4,str,0xfffe);
  pcVar43 = "0xfffe == len2";
  _ok(1,"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "len(mp_decode_str(x, %u))",0xfffe);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0011f778:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0011f799:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0011f788;
LAB_0011f7a9:
      unaff_RBP = (char *)0x10000;
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121b00;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0011f799;
      if (uVar36 != 0xd9) goto LAB_0011f7a9;
      goto LAB_0011f778;
    }
LAB_0011f788:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "len(mp_decode_strbin(x, %u))",0xfffe);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xfffe));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xfffe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "mp_check_str(mp_encode_str(x, 0xfffe))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10002),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "len(mp_decode_str(x, 0xfffe)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10002)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "len(mp_next_str(x, 0xfffe)");
  _ok((uint)(local_70 == buf + 0x10002),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "len(mp_check_str(x, 0xfffe)");
  _ok(1,"mp_sizeof_str(0xfffe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "mp_sizeof_str(0xfffe)");
  iVar37 = bcmp(str,buf + 4,0xfffe);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xfffe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x228,
      "mp_encode_str(x, 0xfffe) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0xffff",0xe,1,_stdout);
  iVar37 = fputc(10,_stdout);
  auVar280 = _DAT_0013f1c0;
  uVar275 = (ushort)((uint)iVar37 >> 0x10);
  local_68 = CONCAT22(uVar275,0xf);
  local_74 = CONCAT22(uVar275,0xe);
  local_78 = (uint)CONCAT62((uint6)uVar275,0xd);
  uVar300 = 0xc;
  uVar301 = 0xb;
  uVar302 = 10;
  uVar303 = 9;
  uVar304 = 8;
  uVar305 = 7;
  uVar342 = 6;
  uVar341 = 5;
  uVar36 = 4;
  uVar376 = 3;
  uVar299 = 2;
  uVar275 = 1;
  auVar63 = _DAT_0013f230;
  auVar73 = _DAT_0013f240;
  auVar89 = _DAT_0013f250;
  auVar114 = _DAT_0013f260;
  auVar129 = _DAT_0013f270;
  auVar136 = _DAT_0013f280;
  auVar157 = _DAT_0013f290;
  auVar182 = _DAT_0013f1b0;
  do {
    auVar176 = auVar182 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar259._4_4_ = iVar37;
    auVar259._0_4_ = iVar37;
    auVar259._8_4_ = iVar77;
    auVar259._12_4_ = iVar77;
    auVar283._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar283._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar283._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar283._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar235._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar235._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar235._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar235._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar235 = auVar235 & auVar283;
    auVar176 = pshuflw(auVar259,auVar235,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    cVar117 = (char)lVar39;
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39] = ((char)(((uint)lVar39 & 0xffff) / 0x1a) * -0x1a + 0x60U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar235,auVar235);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 8 & 1) != 0) {
      str[lVar39 + 1] = (char)(uVar275 / 0x1a) * -0x1a + 'b' + cVar117;
    }
    auVar176 = auVar157 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar260._4_4_ = iVar37;
    auVar260._0_4_ = iVar37;
    auVar260._8_4_ = iVar77;
    auVar260._12_4_ = iVar77;
    auVar284._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar284._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar284._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar284._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar236._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar236._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar236._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar236._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar236 = auVar236 & auVar284;
    auVar176 = packssdw(auVar260,auVar236);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x10 & 1) != 0) {
      str[lVar39 + 2] = ((char)(uVar299 / 0x1a) * -0x1a + 0x62U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar236,auVar236,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x18 & 1) != 0) {
      str[lVar39 + 3] = (char)(uVar376 / 0x1a) * -0x1a + 'd' + cVar117;
    }
    auVar176 = auVar136 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar261._4_4_ = iVar37;
    auVar261._0_4_ = iVar37;
    auVar261._8_4_ = iVar77;
    auVar261._12_4_ = iVar77;
    auVar285._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar285._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar285._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar285._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar237._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar237._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar237._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar237._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar237 = auVar237 & auVar285;
    auVar176 = pshuflw(auVar261,auVar237,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 4] = ((char)((uVar36 & 0xffff) / 0x1a) * -0x1a + 100U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar237,auVar237);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._4_2_ >> 8 & 1) != 0) {
      str[lVar39 + 5] = (char)(uVar341 / 0x1a) * -0x1a + 'f' + cVar117;
    }
    auVar176 = auVar129 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar262._4_4_ = iVar37;
    auVar262._0_4_ = iVar37;
    auVar262._8_4_ = iVar77;
    auVar262._12_4_ = iVar77;
    auVar286._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar286._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar286._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar286._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar238._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar238._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar238._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar238._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar238 = auVar238 & auVar286;
    auVar176 = packssdw(auVar262,auVar238);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 6] = ((char)(uVar342 / 0x1a) * -0x1a + 0x66U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar238,auVar238,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._6_2_ >> 8 & 1) != 0) {
      str[lVar39 + 7] = (char)(uVar305 / 0x1a) * -0x1a + 'h' + cVar117;
    }
    auVar176 = auVar114 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar263._4_4_ = iVar37;
    auVar263._0_4_ = iVar37;
    auVar263._8_4_ = iVar77;
    auVar263._12_4_ = iVar77;
    auVar287._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar287._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar287._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar287._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar239._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar239._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar239._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar239._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar239 = auVar239 & auVar287;
    auVar176 = pshuflw(auVar263,auVar239,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39 + 8] = ((char)(uVar304 / 0x1a) * -0x1a + 0x68U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar239,auVar239);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._8_2_ >> 8 & 1) != 0) {
      str[lVar39 + 9] = (char)(uVar303 / 0x1a) * -0x1a + 'j' + cVar117;
    }
    auVar176 = auVar89 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar264._4_4_ = iVar37;
    auVar264._0_4_ = iVar37;
    auVar264._8_4_ = iVar77;
    auVar264._12_4_ = iVar77;
    auVar288._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar288._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar288._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar288._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar240._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar240._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar240._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar240._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar240 = auVar240 & auVar288;
    auVar176 = packssdw(auVar264,auVar240);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar39 + 10] = ((char)(uVar302 / 0x1a) * -0x1a + 0x6aU | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar240,auVar240,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._10_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xb] = (char)(uVar301 / 0x1a) * -0x1a + 'l' + cVar117;
    }
    auVar176 = auVar73 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar265._4_4_ = iVar37;
    auVar265._0_4_ = iVar37;
    auVar265._8_4_ = iVar77;
    auVar265._12_4_ = iVar77;
    auVar289._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar289._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar289._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar289._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar241._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar241._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar241._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar241._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar241 = auVar241 & auVar289;
    auVar176 = pshuflw(auVar265,auVar241,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xc] = ((char)(uVar300 / 0x1a) * -0x1a + 0x6cU | 1) + cVar117;
    }
    auVar176 = packssdw(auVar241,auVar241);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._12_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xd] = (char)((local_78 & 0xffff) / 0x1a) * -0x1a + 'n' + cVar117;
    }
    auVar176 = auVar63 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar266._4_4_ = iVar37;
    auVar266._0_4_ = iVar37;
    auVar266._8_4_ = iVar77;
    auVar266._12_4_ = iVar77;
    auVar290._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar290._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar290._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar290._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar242._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar242._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar242._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar242._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar242 = auVar242 & auVar290;
    auVar176 = packssdw(auVar266,auVar242);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xe] = ((char)((local_74 & 0xffff) / 0x1a) * -0x1a + 0x6eU | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar242,auVar242,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._14_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xf] = (char)((local_68 & 0xffff) / 0x1a) * -0x1a + 'p' + cVar117;
    }
    lVar39 = lVar39 + 0x10;
    lVar40 = auVar182._8_8_;
    auVar182._0_8_ = auVar182._0_8_ + 0x10;
    auVar182._8_8_ = lVar40 + 0x10;
    lVar40 = auVar157._8_8_;
    auVar157._0_8_ = auVar157._0_8_ + 0x10;
    auVar157._8_8_ = lVar40 + 0x10;
    lVar40 = auVar136._8_8_;
    auVar136._0_8_ = auVar136._0_8_ + 0x10;
    auVar136._8_8_ = lVar40 + 0x10;
    lVar40 = auVar129._8_8_;
    auVar129._0_8_ = auVar129._0_8_ + 0x10;
    auVar129._8_8_ = lVar40 + 0x10;
    lVar40 = auVar114._8_8_;
    auVar114._0_8_ = auVar114._0_8_ + 0x10;
    auVar114._8_8_ = lVar40 + 0x10;
    lVar40 = auVar89._8_8_;
    auVar89._0_8_ = auVar89._0_8_ + 0x10;
    auVar89._8_8_ = lVar40 + 0x10;
    lVar40 = auVar73._8_8_;
    auVar73._0_8_ = auVar73._0_8_ + 0x10;
    auVar73._8_8_ = lVar40 + 0x10;
    lVar40 = auVar63._8_8_;
    auVar63._0_8_ = auVar63._0_8_ + 0x10;
    auVar63._8_8_ = lVar40 + 0x10;
    local_68 = local_68 + 0x10;
    local_74 = local_74 + 0x10;
    local_78 = local_78 + 0x10;
    uVar300 = uVar300 + 0x10;
    uVar301 = uVar301 + 0x10;
    uVar302 = uVar302 + 0x10;
    uVar303 = uVar303 + 0x10;
    uVar304 = uVar304 + 0x10;
    uVar305 = uVar305 + 0x10;
    uVar342 = uVar342 + 0x10;
    uVar341 = uVar341 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar376 = uVar376 + 0x10;
    uVar299 = uVar299 + 0x10;
    uVar275 = uVar275 + 0x10;
  } while (lVar39 != 0x10000);
  buf[1] = -0x26;
  buf[2] = -1;
  buf[3] = -1;
  pcVar51 = buf + 4;
  memcpy(buf + 4,str,0xffff);
  pcVar43 = "0xffff == len2";
  _ok(1,"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "len(mp_decode_str(x, %u))",0xffff);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_00120150:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_00120171:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_00120160;
LAB_00120181:
      unaff_RBP = (char *)0x10000;
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121b05;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_00120171;
      if (uVar36 != 0xd9) goto LAB_00120181;
      goto LAB_00120150;
    }
LAB_00120160:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "len(mp_decode_strbin(x, %u))",0xffff);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xffff));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "mp_check_str(mp_encode_str(x, 0xffff))");
  unaff_RBP = buf + 0x10003;
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10003),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "len(mp_decode_str(x, 0xffff)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10003)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "len(mp_next_str(x, 0xffff)");
  _ok((uint)(local_70 == buf + 0x10003),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "len(mp_check_str(x, 0xffff)");
  _ok(1,"mp_sizeof_str(0xffff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "mp_sizeof_str(0xffff)");
  pcVar51 = buf + 4;
  iVar37 = bcmp(str,buf + 4,0xffff);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xffff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x229,
      "mp_encode_str(x, 0xffff) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0x10000",0xf,1,_stdout);
  fputc(10,_stdout);
  auVar280 = _DAT_0013f3a0;
  auVar64 = _DAT_0013f380;
  auVar74 = _DAT_0013f390;
  do {
    auVar176 = pmulhuw(auVar74,auVar280);
    sVar132 = auVar74._0_2_ + (auVar176._0_2_ >> 3) * -0x1a;
    sVar140 = auVar74._2_2_;
    sVar139 = sVar140 + (auVar176._2_2_ >> 3) * -0x1a;
    sVar142 = auVar74._4_2_;
    sVar141 = sVar142 + (auVar176._4_2_ >> 3) * -0x1a;
    sVar144 = auVar74._6_2_;
    sVar143 = sVar144 + (auVar176._6_2_ >> 3) * -0x1a;
    sVar146 = auVar74._8_2_;
    sVar145 = sVar146 + (auVar176._8_2_ >> 3) * -0x1a;
    sVar148 = auVar74._10_2_;
    sVar147 = sVar148 + (auVar176._10_2_ >> 3) * -0x1a;
    sVar150 = auVar74._12_2_;
    sVar152 = auVar74._14_2_;
    sVar149 = sVar150 + (auVar176._12_2_ >> 3) * -0x1a;
    sVar151 = sVar152 + (auVar176._14_2_ >> 3) * -0x1a;
    auVar176 = pmulhuw(auVar64,auVar280);
    sVar153 = auVar64._0_2_ + (auVar176._0_2_ >> 3) * -0x1a;
    sVar161 = auVar64._2_2_;
    sVar160 = sVar161 + (auVar176._2_2_ >> 3) * -0x1a;
    sVar163 = auVar64._4_2_;
    sVar162 = sVar163 + (auVar176._4_2_ >> 3) * -0x1a;
    sVar165 = auVar64._6_2_;
    sVar164 = sVar165 + (auVar176._6_2_ >> 3) * -0x1a;
    sVar167 = auVar64._8_2_;
    sVar166 = sVar167 + (auVar176._8_2_ >> 3) * -0x1a;
    sVar169 = auVar64._10_2_;
    sVar168 = sVar169 + (auVar176._10_2_ >> 3) * -0x1a;
    sVar171 = auVar64._12_2_;
    sVar173 = auVar64._14_2_;
    sVar170 = sVar171 + (auVar176._12_2_ >> 3) * -0x1a;
    sVar172 = sVar173 + (auVar176._14_2_ >> 3) * -0x1a;
    str[lVar39] = ((0 < sVar132) * (sVar132 < 0x100) * (char)sVar132 - (0xff < sVar132)) + 'a';
    str[lVar39 + 1] = ((0 < sVar139) * (sVar139 < 0x100) * (char)sVar139 - (0xff < sVar139)) + 'a';
    str[lVar39 + 2] = ((0 < sVar141) * (sVar141 < 0x100) * (char)sVar141 - (0xff < sVar141)) + 'a';
    str[lVar39 + 3] = ((0 < sVar143) * (sVar143 < 0x100) * (char)sVar143 - (0xff < sVar143)) + 'a';
    str[lVar39 + 4] = ((0 < sVar145) * (sVar145 < 0x100) * (char)sVar145 - (0xff < sVar145)) + 'a';
    str[lVar39 + 5] = ((0 < sVar147) * (sVar147 < 0x100) * (char)sVar147 - (0xff < sVar147)) + 'a';
    str[lVar39 + 6] = ((0 < sVar149) * (sVar149 < 0x100) * (char)sVar149 - (0xff < sVar149)) + 'a';
    str[lVar39 + 7] = ((0 < sVar151) * (sVar151 < 0x100) * (char)sVar151 - (0xff < sVar151)) + 'a';
    str[lVar39 + 8] = ((0 < sVar153) * (sVar153 < 0x100) * (char)sVar153 - (0xff < sVar153)) + 'a';
    str[lVar39 + 9] = ((0 < sVar160) * (sVar160 < 0x100) * (char)sVar160 - (0xff < sVar160)) + 'a';
    str[lVar39 + 10] = ((0 < sVar162) * (sVar162 < 0x100) * (char)sVar162 - (0xff < sVar162)) + 'a';
    str[lVar39 + 0xb] = ((0 < sVar164) * (sVar164 < 0x100) * (char)sVar164 - (0xff < sVar164)) + 'a'
    ;
    str[lVar39 + 0xc] = ((0 < sVar166) * (sVar166 < 0x100) * (char)sVar166 - (0xff < sVar166)) + 'a'
    ;
    str[lVar39 + 0xd] = ((0 < sVar168) * (sVar168 < 0x100) * (char)sVar168 - (0xff < sVar168)) + 'a'
    ;
    str[lVar39 + 0xe] = ((0 < sVar170) * (sVar170 < 0x100) * (char)sVar170 - (0xff < sVar170)) + 'a'
    ;
    str[lVar39 + 0xf] = ((0 < sVar172) * (sVar172 < 0x100) * (char)sVar172 - (0xff < sVar172)) + 'a'
    ;
    lVar39 = lVar39 + 0x10;
    auVar74._0_2_ = auVar74._0_2_ + 0x10;
    auVar74._2_2_ = sVar140 + 0x10;
    auVar74._4_2_ = sVar142 + 0x10;
    auVar74._6_2_ = sVar144 + 0x10;
    auVar74._8_2_ = sVar146 + 0x10;
    auVar74._10_2_ = sVar148 + 0x10;
    auVar74._12_2_ = sVar150 + 0x10;
    auVar74._14_2_ = sVar152 + 0x10;
    auVar64._0_2_ = auVar64._0_2_ + 0x10;
    auVar64._2_2_ = sVar161 + 0x10;
    auVar64._4_2_ = sVar163 + 0x10;
    auVar64._6_2_ = sVar165 + 0x10;
    auVar64._8_2_ = sVar167 + 0x10;
    auVar64._10_2_ = sVar169 + 0x10;
    auVar64._12_2_ = sVar171 + 0x10;
    auVar64._14_2_ = sVar173 + 0x10;
  } while (lVar39 != 0x10000);
  buf[1] = -0x25;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\0';
  memcpy(buf + 6,str,0x10000);
  pcVar43 = "0x10000 == len2";
  _ok(1,"0x10000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "len(mp_decode_str(x, %u))",0x10000);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_001204cc:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_001204e9:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_001204dc;
LAB_001204f9:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121b0a;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_001204e9;
      if (uVar36 != 0xd9) goto LAB_001204f9;
      goto LAB_001204cc;
    }
LAB_001204dc:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x10000),"0x10000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "len(mp_decode_strbin(x, %u))",0x10000);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x10000));
  uVar52 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x10000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "mp_check_str(mp_encode_str(x, 0x10000))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10006),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "len(mp_decode_str(x, 0x10000)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10006)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "len(mp_next_str(x, 0x10000)");
  _ok((uint)(local_70 == buf + 0x10006),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "len(mp_check_str(x, 0x10000)");
  local_68._0_2_ = 1;
  local_68._2_2_ = 0;
  _ok(1,"mp_sizeof_str(0x10000) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "mp_sizeof_str(0x10000)");
  iVar37 = bcmp(str,buf + 6,0x10000);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x10000) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22a,
      "mp_encode_str(x, 0x10000) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str len=0x10001",0xf,1,_stdout);
  local_74 = 10;
  fputc(10,_stdout);
  auVar280 = _DAT_0013f1c0;
  local_78 = 0xf;
  uVar53 = 0xe;
  uVar41 = 0xd;
  uVar44 = 0xc;
  uVar46 = 0xb;
  uVar47 = 9;
  uVar48 = 8;
  uVar49 = 7;
  uVar50 = 6;
  uVar54 = 5;
  uVar42 = 4;
  uVar55 = 3;
  unaff_RBP = (char *)0x2;
  auVar65 = _DAT_0013f230;
  auVar75 = _DAT_0013f240;
  auVar90 = _DAT_0013f250;
  auVar115 = _DAT_0013f260;
  auVar130 = _DAT_0013f270;
  auVar137 = _DAT_0013f280;
  auVar158 = _DAT_0013f290;
  auVar183 = _DAT_0013f1b0;
  do {
    auVar176 = auVar183 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar267._4_4_ = iVar37;
    auVar267._0_4_ = iVar37;
    auVar267._8_4_ = iVar77;
    auVar267._12_4_ = iVar77;
    auVar291._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar291._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar291._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar291._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar243._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar243._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar243._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar243._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar243 = auVar243 & auVar291;
    auVar176 = pshuflw(auVar267,auVar243,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    cVar117 = (char)uVar52;
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[uVar52] = (0x60U - ((char)((uVar52 & 0xffffffff) / 0x1a) * '\x19' +
                             (char)((uVar52 & 0xffffffff) / 0x1a)) | 1) + cVar117;
    }
    auVar176 = packssdw(auVar243,auVar243);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 8 & 1) != 0) {
      str[uVar52 + 1] = ((char)(local_68 / 0x1a) * -0x19 - (char)(local_68 / 0x1a)) + 'b' + cVar117;
    }
    auVar176 = auVar158 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar268._4_4_ = iVar37;
    auVar268._0_4_ = iVar37;
    auVar268._8_4_ = iVar77;
    auVar268._12_4_ = iVar77;
    auVar292._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar292._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar292._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar292._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar244._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar244._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar244._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar244._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar244 = auVar244 & auVar292;
    auVar176 = packssdw(auVar268,auVar244);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x10 & 1) != 0) {
      str[uVar52 + 2] =
           (0x62U - ((char)((ulong)unaff_RBP / 0x1a) * '\x19' + (char)((ulong)unaff_RBP / 0x1a)) | 1
           ) + cVar117;
    }
    auVar176 = pshufhw(auVar244,auVar244,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x18 & 1) != 0) {
      str[uVar52 + 3] = ((char)(uVar55 / 0x1a) * -0x19 - (char)(uVar55 / 0x1a)) + 'd' + cVar117;
    }
    auVar176 = auVar137 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar269._4_4_ = iVar37;
    auVar269._0_4_ = iVar37;
    auVar269._8_4_ = iVar77;
    auVar269._12_4_ = iVar77;
    auVar293._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar293._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar293._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar293._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar245._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar245._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar245._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar245._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar245 = auVar245 & auVar293;
    auVar176 = pshuflw(auVar269,auVar245,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[uVar52 + 4] =
           (100U - ((char)(uVar42 / 0x1a) * '\x19' + (char)(uVar42 / 0x1a)) | 1) + cVar117;
    }
    auVar176 = packssdw(auVar245,auVar245);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._4_2_ >> 8 & 1) != 0) {
      str[uVar52 + 5] = ((char)(uVar54 / 0x1a) * -0x19 - (char)(uVar54 / 0x1a)) + 'f' + cVar117;
    }
    auVar176 = auVar130 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar270._4_4_ = iVar37;
    auVar270._0_4_ = iVar37;
    auVar270._8_4_ = iVar77;
    auVar270._12_4_ = iVar77;
    auVar294._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar294._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar294._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar294._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar246._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar246._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar246._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar246._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar246 = auVar246 & auVar294;
    auVar176 = packssdw(auVar270,auVar246);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[uVar52 + 6] =
           (0x66U - ((char)(uVar50 / 0x1a) * '\x19' + (char)(uVar50 / 0x1a)) | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar246,auVar246,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._6_2_ >> 8 & 1) != 0) {
      str[uVar52 + 7] = ((char)(uVar49 / 0x1a) * -0x19 - (char)(uVar49 / 0x1a)) + 'h' + cVar117;
    }
    auVar176 = auVar115 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar271._4_4_ = iVar37;
    auVar271._0_4_ = iVar37;
    auVar271._8_4_ = iVar77;
    auVar271._12_4_ = iVar77;
    auVar295._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar295._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar295._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar295._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar247._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar247._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar247._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar247._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar247 = auVar247 & auVar295;
    auVar176 = pshuflw(auVar271,auVar247,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[uVar52 + 8] =
           (0x68U - ((char)(uVar48 / 0x1a) * '\x19' + (char)(uVar48 / 0x1a)) | 1) + cVar117;
    }
    auVar176 = packssdw(auVar247,auVar247);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._8_2_ >> 8 & 1) != 0) {
      str[uVar52 + 9] = ((char)(uVar47 / 0x1a) * -0x19 - (char)(uVar47 / 0x1a)) + 'j' + cVar117;
    }
    auVar176 = auVar90 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar272._4_4_ = iVar37;
    auVar272._0_4_ = iVar37;
    auVar272._8_4_ = iVar77;
    auVar272._12_4_ = iVar77;
    auVar296._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar296._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar296._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar296._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar248._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar248._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar248._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar248._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar248 = auVar248 & auVar296;
    auVar176 = packssdw(auVar272,auVar248);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[uVar52 + 10] =
           (0x6aU - ((char)(local_74 / 0x1a) * '\x19' + (char)(local_74 / 0x1a)) | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar248,auVar248,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._10_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xb] = ((char)(uVar46 / 0x1a) * -0x19 - (char)(uVar46 / 0x1a)) + 'l' + cVar117;
    }
    auVar176 = auVar75 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar273._4_4_ = iVar37;
    auVar273._0_4_ = iVar37;
    auVar273._8_4_ = iVar77;
    auVar273._12_4_ = iVar77;
    auVar297._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar297._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar297._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar297._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar249._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar249._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar249._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar249._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar249 = auVar249 & auVar297;
    auVar176 = pshuflw(auVar273,auVar249,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[uVar52 + 0xc] =
           (0x6cU - ((char)(uVar44 / 0x1a) * '\x19' + (char)(uVar44 / 0x1a)) | 1) + cVar117;
    }
    auVar176 = packssdw(auVar249,auVar249);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._12_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xd] = ((char)(uVar41 / 0x1a) * -0x19 - (char)(uVar41 / 0x1a)) + 'n' + cVar117;
    }
    auVar176 = auVar65 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar274._4_4_ = iVar37;
    auVar274._0_4_ = iVar37;
    auVar274._8_4_ = iVar77;
    auVar274._12_4_ = iVar77;
    auVar298._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar298._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar298._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar298._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar250._0_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar250._4_4_ = -(uint)(auVar176._4_4_ == -0x80000000);
    auVar250._8_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar250._12_4_ = -(uint)(auVar176._12_4_ == -0x80000000);
    auVar250 = auVar250 & auVar298;
    auVar176 = packssdw(auVar274,auVar250);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[uVar52 + 0xe] =
           (0x6eU - ((char)(uVar53 / 0x1a) * '\x19' + (char)(uVar53 / 0x1a)) | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar250,auVar250,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._14_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xf] =
           ((char)(local_78 / 0x1a) * -0x19 - (char)(local_78 / 0x1a)) + 'p' + cVar117;
    }
    uVar52 = uVar52 + 0x10;
    lVar39 = auVar183._8_8_;
    auVar183._0_8_ = auVar183._0_8_ + 0x10;
    auVar183._8_8_ = lVar39 + 0x10;
    lVar39 = auVar158._8_8_;
    auVar158._0_8_ = auVar158._0_8_ + 0x10;
    auVar158._8_8_ = lVar39 + 0x10;
    lVar39 = auVar137._8_8_;
    auVar137._0_8_ = auVar137._0_8_ + 0x10;
    auVar137._8_8_ = lVar39 + 0x10;
    lVar39 = auVar130._8_8_;
    auVar130._0_8_ = auVar130._0_8_ + 0x10;
    auVar130._8_8_ = lVar39 + 0x10;
    lVar39 = auVar115._8_8_;
    auVar115._0_8_ = auVar115._0_8_ + 0x10;
    auVar115._8_8_ = lVar39 + 0x10;
    lVar39 = auVar90._8_8_;
    auVar90._0_8_ = auVar90._0_8_ + 0x10;
    auVar90._8_8_ = lVar39 + 0x10;
    lVar39 = auVar75._8_8_;
    auVar75._0_8_ = auVar75._0_8_ + 0x10;
    auVar75._8_8_ = lVar39 + 0x10;
    lVar39 = auVar65._8_8_;
    auVar65._0_8_ = auVar65._0_8_ + 0x10;
    auVar65._8_8_ = lVar39 + 0x10;
    local_78 = local_78 + 0x10;
    uVar53 = (ulong)((int)uVar53 + 0x10);
    uVar41 = (ulong)((int)uVar41 + 0x10);
    uVar44 = (ulong)((int)uVar44 + 0x10);
    uVar46 = (ulong)((int)uVar46 + 0x10);
    local_74 = local_74 + 0x10;
    uVar47 = (ulong)((int)uVar47 + 0x10);
    uVar48 = (ulong)((int)uVar48 + 0x10);
    uVar49 = (ulong)((int)uVar49 + 0x10);
    uVar50 = (ulong)((int)uVar50 + 0x10);
    uVar54 = (ulong)((int)uVar54 + 0x10);
    uVar42 = (ulong)((int)uVar42 + 0x10);
    uVar55 = (ulong)((int)uVar55 + 0x10);
    unaff_RBP = (char *)(ulong)((int)unaff_RBP + 0x10);
    local_68 = local_68 + 0x10;
  } while (uVar52 != 0x10010);
  buf[1] = -0x25;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\x01';
  pcVar51 = buf + 6;
  memcpy(buf + 6,str,0x10001);
  pcVar43 = "0x10001 == len2";
  _ok(1,"0x10001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "len(mp_decode_str(x, %u))",0x10001);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 != 0xc4) {
      if (uVar36 == 0xc5) {
LAB_00120f1f:
        uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
        pcVar51 = buf + 4;
      }
      else {
        if (uVar36 == 0xc6) goto LAB_00120f15;
LAB_00120f36:
        if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00121b0f;
        uVar36 = uVar36 & 0x1f;
        pcVar51 = buf + 2;
      }
      goto LAB_00120f4c;
    }
  }
  else {
    if (uVar36 == 0xdb) {
LAB_00120f15:
      uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
               CONCAT13(buf[5],uVar22) << 0x18;
      goto LAB_00120f4c;
    }
    if (uVar36 == 0xda) goto LAB_00120f1f;
    if (uVar36 != 0xd9) goto LAB_00120f36;
  }
  uVar36 = (uint)(byte)buf[2];
  pcVar51 = buf + 3;
LAB_00120f4c:
  _ok((uint)(uVar36 == 0x10001),"0x10001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "len(mp_decode_strbin(x, %u))",0x10001);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar100 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar100);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x10001));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x10001)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "mp_check_str(mp_encode_str(x, 0x10001))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10007),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "len(mp_decode_str(x, 0x10001)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10007)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "len(mp_next_str(x, 0x10001)");
  _ok((uint)(local_70 == buf + 0x10007),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "len(mp_check_str(x, 0x10001)");
  _ok(1,"mp_sizeof_str(0x10001) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "mp_sizeof_str(0x10001)");
  iVar37 = bcmp(str,buf + 6,0x10001);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x10001) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22b,
      "mp_encode_str(x, 0x10001) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("str_safe",8,1,_stdout);
  iVar37 = fputc(10,_stdout);
  auVar280 = _DAT_0013f1c0;
  uVar275 = (ushort)((uint)iVar37 >> 0x10);
  local_68 = CONCAT22(uVar275,0xf);
  local_74 = CONCAT22(uVar275,0xe);
  local_78 = (uint)CONCAT62((uint6)uVar275,0xd);
  uVar301 = 0xc;
  uVar302 = 0xb;
  uVar303 = 10;
  uVar36 = 9;
  uVar304 = 8;
  uVar305 = 7;
  uVar299 = 6;
  uVar300 = 5;
  uVar376 = 4;
  uVar341 = 3;
  uVar342 = 2;
  uVar275 = 1;
  auVar66 = _DAT_0013f230;
  auVar76 = _DAT_0013f240;
  auVar91 = _DAT_0013f250;
  auVar116 = _DAT_0013f260;
  auVar131 = _DAT_0013f270;
  auVar138 = _DAT_0013f280;
  auVar159 = _DAT_0013f290;
  auVar184 = _DAT_0013f1b0;
  do {
    auVar176 = auVar184 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar219._4_4_ = iVar37;
    auVar219._0_4_ = iVar37;
    auVar219._8_4_ = iVar77;
    auVar219._12_4_ = iVar77;
    auVar251._0_4_ = -(uint)(iVar37 < local_48);
    auVar251._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar251._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar251._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar199._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar199._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar199._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar199._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar199 = auVar199 & auVar251;
    auVar176 = pshuflw(auVar219,auVar199,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    cVar117 = (char)lVar39;
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39] = ((char)(((uint)lVar39 & 0xffff) / 0x1a) * -0x1a + 0x60U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar199,auVar199);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 8 & 1) != 0) {
      str[lVar39 + 1] = (char)(uVar275 / 0x1a) * -0x1a + 'b' + cVar117;
    }
    auVar176 = auVar159 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar220._4_4_ = iVar37;
    auVar220._0_4_ = iVar37;
    auVar220._8_4_ = iVar77;
    auVar220._12_4_ = iVar77;
    auVar252._0_4_ = -(uint)(iVar37 < local_48);
    auVar252._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar252._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar252._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar200._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar200._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar200._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar200._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar200 = auVar200 & auVar252;
    auVar176 = packssdw(auVar220,auVar200);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x10 & 1) != 0) {
      str[lVar39 + 2] = ((char)(uVar342 / 0x1a) * -0x1a + 0x62U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar200,auVar200,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._0_4_ >> 0x18 & 1) != 0) {
      str[lVar39 + 3] = (char)(uVar341 / 0x1a) * -0x1a + 'd' + cVar117;
    }
    auVar176 = auVar138 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar221._4_4_ = iVar37;
    auVar221._0_4_ = iVar37;
    auVar221._8_4_ = iVar77;
    auVar221._12_4_ = iVar77;
    auVar253._0_4_ = -(uint)(iVar37 < local_48);
    auVar253._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar253._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar253._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar201._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar201._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar201._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar201._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar201 = auVar201 & auVar253;
    auVar176 = pshuflw(auVar221,auVar201,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 4] = ((char)(uVar376 / 0x1a) * -0x1a + 100U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar201,auVar201);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._4_2_ >> 8 & 1) != 0) {
      str[lVar39 + 5] = (char)(uVar300 / 0x1a) * -0x1a + 'f' + cVar117;
    }
    auVar176 = auVar131 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar222._4_4_ = iVar37;
    auVar222._0_4_ = iVar37;
    auVar222._8_4_ = iVar77;
    auVar222._12_4_ = iVar77;
    auVar254._0_4_ = -(uint)(iVar37 < local_48);
    auVar254._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar254._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar254._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar202._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar202._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar202._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar202._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar202 = auVar202 & auVar254;
    auVar176 = packssdw(auVar222,auVar202);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 6] = ((char)(uVar299 / 0x1a) * -0x1a + 0x66U | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar202,auVar202,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._6_2_ >> 8 & 1) != 0) {
      str[lVar39 + 7] = (char)(uVar305 / 0x1a) * -0x1a + 'h' + cVar117;
    }
    auVar176 = auVar116 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar223._4_4_ = iVar37;
    auVar223._0_4_ = iVar37;
    auVar223._8_4_ = iVar77;
    auVar223._12_4_ = iVar77;
    auVar255._0_4_ = -(uint)(iVar37 < local_48);
    auVar255._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar255._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar255._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar203._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar203._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar203._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar203._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar203 = auVar203 & auVar255;
    auVar176 = pshuflw(auVar223,auVar203,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39 + 8] = ((char)(uVar304 / 0x1a) * -0x1a + 0x68U | 1) + cVar117;
    }
    auVar176 = packssdw(auVar203,auVar203);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._8_2_ >> 8 & 1) != 0) {
      str[lVar39 + 9] = (char)((uVar36 & 0xffff) / 0x1a) * -0x1a + 'j' + cVar117;
    }
    auVar176 = auVar91 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar224._4_4_ = iVar37;
    auVar224._0_4_ = iVar37;
    auVar224._8_4_ = iVar77;
    auVar224._12_4_ = iVar77;
    auVar256._0_4_ = -(uint)(iVar37 < local_48);
    auVar256._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar256._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar256._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar204._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar204._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar204._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar204._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar204 = auVar204 & auVar256;
    auVar176 = packssdw(auVar224,auVar204);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar39 + 10] = ((char)(uVar303 / 0x1a) * -0x1a + 0x6aU | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar204,auVar204,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._10_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xb] = (char)(uVar302 / 0x1a) * -0x1a + 'l' + cVar117;
    }
    auVar176 = auVar76 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar225._4_4_ = iVar37;
    auVar225._0_4_ = iVar37;
    auVar225._8_4_ = iVar77;
    auVar225._12_4_ = iVar77;
    auVar257._0_4_ = -(uint)(iVar37 < local_48);
    auVar257._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar257._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar257._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar205._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar205._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar205._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar205._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar205 = auVar205 & auVar257;
    auVar176 = pshuflw(auVar225,auVar205,0xe8);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xc] = ((char)(uVar301 / 0x1a) * -0x1a + 0x6cU | 1) + cVar117;
    }
    auVar176 = packssdw(auVar205,auVar205);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._12_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xd] = (char)((local_78 & 0xffff) / 0x1a) * -0x1a + 'n' + cVar117;
    }
    auVar176 = auVar66 ^ auVar280;
    iVar37 = auVar176._0_4_;
    iVar77 = auVar176._8_4_;
    auVar226._4_4_ = iVar37;
    auVar226._0_4_ = iVar37;
    auVar226._8_4_ = iVar77;
    auVar226._12_4_ = iVar77;
    auVar258._0_4_ = -(uint)(iVar37 < local_48);
    auVar258._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar258._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar258._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar206._0_4_ = -(uint)(auVar176._4_4_ == local_58);
    auVar206._4_4_ = -(uint)(auVar176._4_4_ == iStack_54);
    auVar206._8_4_ = -(uint)(auVar176._12_4_ == iStack_50);
    auVar206._12_4_ = -(uint)(auVar176._12_4_ == iStack_4c);
    auVar206 = auVar206 & auVar258;
    auVar176 = packssdw(auVar226,auVar206);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xe] = ((char)((local_74 & 0xffff) / 0x1a) * -0x1a + 0x6eU | 1) + cVar117;
    }
    auVar176 = pshufhw(auVar206,auVar206,0x84);
    auVar176 = packssdw(auVar176,auVar176);
    auVar176 = packsswb(auVar176,auVar176);
    if ((auVar176._14_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xf] = (char)((local_68 & 0xffff) / 0x1a) * -0x1a + 'p' + cVar117;
    }
    lVar39 = lVar39 + 0x10;
    lVar40 = auVar184._8_8_;
    auVar184._0_8_ = auVar184._0_8_ + 0x10;
    auVar184._8_8_ = lVar40 + 0x10;
    lVar40 = auVar159._8_8_;
    auVar159._0_8_ = auVar159._0_8_ + 0x10;
    auVar159._8_8_ = lVar40 + 0x10;
    lVar40 = auVar138._8_8_;
    auVar138._0_8_ = auVar138._0_8_ + 0x10;
    auVar138._8_8_ = lVar40 + 0x10;
    lVar40 = auVar131._8_8_;
    auVar131._0_8_ = auVar131._0_8_ + 0x10;
    auVar131._8_8_ = lVar40 + 0x10;
    lVar40 = auVar116._8_8_;
    auVar116._0_8_ = auVar116._0_8_ + 0x10;
    auVar116._8_8_ = lVar40 + 0x10;
    lVar40 = auVar91._8_8_;
    auVar91._0_8_ = auVar91._0_8_ + 0x10;
    auVar91._8_8_ = lVar40 + 0x10;
    lVar40 = auVar76._8_8_;
    auVar76._0_8_ = auVar76._0_8_ + 0x10;
    auVar76._8_8_ = lVar40 + 0x10;
    lVar40 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 0x10;
    auVar66._8_8_ = lVar40 + 0x10;
    local_68 = local_68 + 0x10;
    local_74 = local_74 + 0x10;
    local_78 = local_78 + 0x10;
    uVar301 = uVar301 + 0x10;
    uVar302 = uVar302 + 0x10;
    uVar303 = uVar303 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar304 = uVar304 + 0x10;
    uVar305 = uVar305 + 0x10;
    uVar299 = uVar299 + 0x10;
    uVar300 = uVar300 + 0x10;
    uVar376 = uVar376 + 0x10;
    uVar341 = uVar341 + 0x10;
    uVar342 = uVar342 + 0x10;
    uVar275 = uVar275 + 0x10;
  } while (lVar39 != 0x10000);
  local_80 = (byte *)CONCAT53(local_80._3_5_,0xfeffda);
  _ok(1,"-sz == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "size after mp_encode_str_safe(NULL, &sz)");
  _ok(1,"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "mp_encode_str_safe(NULL, &sz)");
  buf[1] = -0x26;
  buf[2] = -1;
  buf[3] = -2;
  memcpy(buf + 4,str,0xfffe);
  _ok(1,"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "size after mp_encode_str_safe(buf, &sz)");
  _ok(1,"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "len of mp_encode_str_safe(buf, &sz)");
  _ok((uint)(buf[3] == local_80._2_1_ && CONCAT11(buf[2],buf[1]) == (short)local_80),
      "memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "head of mp_encode_str_safe(buf, &sz)");
  iVar37 = bcmp(buf + 4,str,0xfffe);
  _ok((uint)(iVar37 == 0),"memcmp(data + hl, str, (0xfffe)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "payload of mp_encode_str_safe(buf, &sz)");
  _ok(1,"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "size after mp_encode_str_safe(buf, &sz) overflow");
  _ok(1,"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "mp_encode_str_safe(buf, &sz) overflow");
  buf[1] = -0x26;
  buf[2] = -1;
  buf[3] = -2;
  memcpy(buf + 4,str,0xfffe);
  _ok(1,"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "len of mp_encode_str_safe(buf, NULL)");
  _ok((uint)(buf[3] == local_80._2_1_ && CONCAT11(buf[2],buf[1]) == (short)local_80),
      "memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "head of mp_encode_str_safe(buf, NULL)");
  iVar37 = bcmp(buf + 4,str,0xfffe);
  _ok((uint)(iVar37 == 0),"memcmp(data + hl, str, (0xfffe)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x22d,
      "payload of mp_encode_str_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_strs");
  iVar37 = check_plan();
  return iVar37;
}

Assistant:

static int
test_strs(void)
{
	plan(12*8 + 11);
	header();

	test_str(0x01);
	test_str(0x1e);
	test_str(0x1f);
	test_str(0x20);
	test_str(0xfe);
	test_str(0xff);
	test_str(0x100);
	test_str(0x101);
	test_str(0xfffe);
	test_str(0xffff);
	test_str(0x10000);
	test_str(0x10001);

	test_str_safe(0xfffe);

	footer();
	return check_plan();
}